

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles2::Performance::ShaderCompilerCase::iterate(ShaderCompilerCase *this)

{
  ostringstream *poVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestContext *this_00;
  pointer pAVar3;
  deUint32 dVar4;
  _Alloc_hider _Var5;
  pointer pMVar6;
  undefined4 uVar7;
  pointer *pplVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  pointer pcVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  deUint64 dVar14;
  deUint64 dVar15;
  deUint64 dVar16;
  deUint64 dVar17;
  deUint64 dVar18;
  long *plVar19;
  ulong uVar20;
  size_t sVar21;
  size_type *psVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  pointer *pplVar24;
  deUint32 extraout_EDX;
  deUint32 extraout_EDX_00;
  deUint32 extraout_EDX_01;
  deUint32 dVar25;
  int precision;
  long lVar26;
  long *plVar27;
  _Alloc_hider _Var28;
  pointer *pplVar29;
  char *pcVar30;
  byte bVar31;
  undefined1 *puVar32;
  char *pcVar33;
  ulong uVar34;
  TestLog *pTVar35;
  ShaderCompilerCase *pSVar36;
  long *__args;
  long *__args_00;
  long lVar37;
  float fVar38;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  ShadersAndProgram SVar39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_21;
  string statNamePrefix_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  char *vertShaderSourceCStr_1;
  ProgramContext progCtx;
  vector<long,_std::allocator<long>_> rangeTotalTimes;
  vector<long,_std::allocator<long>_> rangeSpecializationTimes;
  BuildInfo buildInfo;
  vector<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
  measurements;
  vector<long,_std::allocator<long>_> totalTimesWithoutDraw;
  vector<long,_std::allocator<long>_> specializationTimes;
  deInt64 specializationTime;
  deInt64 timeWithoutDraw;
  ProgramContext latestProgramContext;
  vector<long,_std::allocator<long>_> secondDrawTimes;
  vector<long,_std::allocator<long>_> secondInputTimes;
  vector<long,_std::allocator<long>_> firstDrawTimes;
  vector<long,_std::allocator<long>_> firstInputSetTimes;
  vector<long,_std::allocator<long>_> programLinkTimes;
  vector<long,_std::allocator<long>_> fragmentCompileTimes;
  vector<long,_std::allocator<long>_> vertexCompileTimes;
  vector<long,_std::allocator<long>_> sourceSetTimes;
  vector<long,_std::allocator<long>_> secondPhaseTimes;
  vector<long,_std::allocator<long>_> firstPhaseTimes;
  BuildInfo latestBuildInfo;
  string local_7e8;
  string local_7c8;
  string local_7a8;
  string local_788;
  string local_768;
  string local_748;
  TestLog *local_728;
  string local_720;
  ShaderCompilerCase *local_700;
  string local_6f8;
  long *local_6d8;
  long local_6d0;
  long local_6c8;
  long lStack_6c0;
  string local_6b8;
  undefined8 local_698;
  deUint64 local_688;
  undefined1 local_680 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_670;
  _Alloc_hider local_660;
  size_type sStack_658;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_650;
  _Alloc_hider local_640;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_630;
  qpKeyValueTag local_620;
  float local_61c;
  undefined1 local_618 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_608;
  string local_5f8;
  undefined1 local_5d8 [16];
  undefined1 local_5c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5b8;
  ios_base local_5a8 [8];
  ios_base local_5a0 [264];
  string local_498;
  vector<long,_std::allocator<long>_> local_478;
  long lStack_460;
  undefined1 local_458 [2];
  bool bStack_456;
  undefined5 uStack_455;
  _Alloc_hider local_450;
  undefined1 local_448 [24];
  _Alloc_hider local_430;
  undefined1 local_428 [24];
  _Alloc_hider local_410;
  undefined1 local_408 [40];
  ios_base local_3e0 [264];
  vector<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
  local_2d8;
  vector<long,_std::allocator<long>_> local_2b8;
  vector<long,_std::allocator<long>_> local_298;
  deUint64 local_280;
  long local_278;
  long local_270;
  undefined1 local_268 [32];
  _Alloc_hider local_248;
  size_type local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  undefined1 local_228 [24];
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  vStack_210;
  vector<long,_std::allocator<long>_> local_1f8;
  vector<long,_std::allocator<long>_> local_1d8;
  vector<long,_std::allocator<long>_> local_1b8;
  vector<long,_std::allocator<long>_> local_198;
  vector<long,_std::allocator<long>_> local_178;
  vector<long,_std::allocator<long>_> local_158;
  vector<long,_std::allocator<long>_> local_138;
  vector<long,_std::allocator<long>_> local_118;
  vector<long,_std::allocator<long>_> local_f8;
  vector<long,_std::allocator<long>_> local_d8;
  undefined1 local_c0 [8];
  _Alloc_hider _Stack_b8;
  pointer local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  ulong local_58;
  long *local_50 [2];
  long local_40 [2];
  
  uVar12 = this->m_startHash ^ 0xc0a9496a;
  if (this->m_avoidCache == false) {
    uVar12 = this->m_startHash;
  }
  local_618._0_8_ = local_618 + 0x10;
  local_618._8_8_ = 0;
  local_608._M_allocated_capacity = local_608._M_allocated_capacity & 0xffffffffffffff00;
  local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
  local_5f8._M_string_length = 0;
  local_5f8.field_2._M_local_buf[0] = '\0';
  local_5d8._0_8_ = (pointer)0x0;
  local_5d8._8_8_ = (pointer)0x0;
  local_5c8._0_8_ = (pointer)0x0;
  local_5c8._8_8_ = (pointer)0x0;
  local_5b8._M_allocated_capacity = 0;
  local_5b8._8_8_ = (pointer)0x0;
  local_268._0_8_ = local_268 + 0x10;
  local_c0[0] = true;
  local_c0[1] = true;
  local_c0[2] = false;
  local_c0[3] = 0;
  local_c0._4_4_ = 0;
  pcVar13 = (pointer)std::__cxx11::string::_M_create((ulong *)local_268,(ulong)local_c0);
  pAVar3 = (pointer)CONCAT44(local_c0._4_4_,
                             CONCAT13(local_c0[3],CONCAT12(local_c0[2],local_c0._0_2_)));
  local_268._0_8_ = pcVar13;
  local_268._16_8_ = pAVar3;
  memcpy(pcVar13,
         "attribute highp vec4 a_position${NAME_SPEC};\nattribute mediump vec4 a_value${NAME_SPEC};\nvarying mediump vec4 v_value${NAME_SPEC};\n\nvoid main()\n{\n\tgl_Position = a_position${NAME_SPEC} * (0.95 + 0.05*${FLOAT01});\n\tv_value${NAME_SPEC} = a_value${NAME_SPEC};\n${SEMANTIC_ERROR}}\n${INVALID_CHAR}"
         ,0x122);
  pcVar13[(long)pAVar3] = '\0';
  local_268._8_8_ = pAVar3;
  specializeShaderSource((string *)local_458,(string *)local_268,uVar12,SHADER_VALIDITY_VALID);
  std::__cxx11::string::operator=((string *)local_618,(string *)local_458);
  if (_local_458 != local_448) {
    operator_delete(_local_458,local_448._0_8_ + 1);
  }
  if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
    operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
  }
  local_268._0_8_ = local_268 + 0x10;
  local_c0[0] = true;
  local_c0[1] = false;
  local_c0[2] = false;
  local_c0[3] = 0;
  local_c0._4_4_ = 0;
  pcVar13 = (pointer)std::__cxx11::string::_M_create((ulong *)local_268,(ulong)local_c0);
  pAVar3 = (pointer)CONCAT44(local_c0._4_4_,
                             CONCAT13(local_c0[3],CONCAT12(local_c0[2],local_c0._0_2_)));
  local_268._0_8_ = pcVar13;
  local_268._16_8_ = pAVar3;
  memcpy(pcVar13,
         "varying mediump vec4 v_value${NAME_SPEC};\n\nvoid main()\n{\n\tgl_FragColor = v_value${NAME_SPEC} + ${FLOAT01};\n${SEMANTIC_ERROR}}\n${INVALID_CHAR}"
         ,0x8d);
  pcVar13[(long)pAVar3] = '\0';
  local_268._8_8_ = pAVar3;
  specializeShaderSource((string *)local_458,(string *)local_268,uVar12,SHADER_VALIDITY_VALID);
  std::__cxx11::string::operator=((string *)&local_5f8,(string *)local_458);
  dVar25 = extraout_EDX;
  if (_local_458 != local_448) {
    operator_delete(_local_458,local_448._0_8_ + 1);
    dVar25 = extraout_EDX_00;
  }
  if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
    operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
    dVar25 = extraout_EDX_01;
  }
  getNameSpecialization_abi_cxx11_((string *)local_458,(Performance *)(ulong)uVar12,dVar25);
  singleValueShaderAttributes
            ((vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
              *)local_c0,(string *)local_458);
  local_268._16_8_ = local_5c8._0_8_;
  pAVar3 = (pointer)CONCAT44(local_c0._4_4_,
                             CONCAT13(local_c0[3],CONCAT12(local_c0[2],local_c0._0_2_)));
  local_5c8._0_8_ = local_b0;
  local_268._0_8_ = local_5d8._0_8_;
  local_268._8_8_ = local_5d8._8_8_;
  local_c0[0] = false;
  local_c0[1] = false;
  local_c0[2] = false;
  local_c0[3] = 0;
  local_c0._4_4_ = 0;
  _Stack_b8._M_p._0_4_ = 0;
  _Stack_b8._M_p._4_4_ = 0;
  local_b0 = (pointer)0x0;
  local_5d8._0_8_ = pAVar3;
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ::~vector((vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
             *)local_268);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ::~vector((vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
             *)local_c0);
  if (_local_458 != local_448) {
    operator_delete(_local_458,local_448._0_8_ + 1);
  }
  local_700 = this;
  SVar39 = createShadersAndProgram(this);
  dVar25 = SVar39.program;
  uVar20 = SVar39._0_8_;
  local_c0._0_2_ = (undefined2)SVar39.vertShader;
  local_c0[2] = SVar39.vertShader._2_1_;
  local_c0[3] = SVar39.vertShader._3_1_;
  local_c0._4_4_ = SVar39.fragShader;
  uVar7 = local_c0._4_4_;
  _Stack_b8._M_p._0_4_ = dVar25;
  iVar11 = (*((local_700->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  _local_458 = (pointer)local_618._0_8_;
  local_268._0_8_ = local_5f8._M_dataplus._M_p;
  (**(code **)(CONCAT44(extraout_var,iVar11) + 0x12b8))(uVar20 & 0xffffffff,1,local_458,0);
  (**(code **)(CONCAT44(extraout_var,iVar11) + 0x12b8))(uVar7,1,local_268,0);
  local_450._M_p = local_448 + 8;
  local_448._0_8_ = 0;
  local_448[8] = '\0';
  local_430._M_p = local_428 + 8;
  local_428._0_8_ = 0;
  local_428[8] = '\0';
  local_410._M_p = local_408 + 8;
  local_408._0_8_ = 0;
  local_408[8] = '\0';
  iVar11 = (*((local_700->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_268._0_8_ = local_268._0_8_ & 0xffffffff00000000;
  (**(code **)(CONCAT44(extraout_var_00,iVar11) + 0x248))(uVar20 & 0xffffffff);
  (**(code **)(CONCAT44(extraout_var_00,iVar11) + 0xa70))(uVar20 & 0xffffffff,0x8b81,local_268);
  local_458[0] = (string)(local_268._0_4_ != 0);
  iVar11 = (*((local_700->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_268._0_8_ = local_268._0_8_ & 0xffffffff00000000;
  (**(code **)(CONCAT44(extraout_var_01,iVar11) + 0x248))(uVar7);
  (**(code **)(CONCAT44(extraout_var_01,iVar11) + 0xa70))(uVar7,0x8b81,local_268);
  local_458[1] = local_268._0_4_ != 0;
  bVar10 = linkAndUseProgram(local_700,dVar25);
  _Var28._M_p = _local_458;
  pSVar36 = local_700;
  bStack_456 = bVar10;
  _Var5._M_p = _local_458;
  local_458[1] = SUB81(_Var28._M_p,1);
  local_458[0] = SUB81(_Var28._M_p,0);
  bVar31 = bVar10 & local_458[1] & (byte)local_458[0];
  _local_458 = _Var5._M_p;
  if (bVar31 == 0) {
    getLogs((Logs *)local_268,local_700,(ShadersAndProgram *)local_c0);
    std::__cxx11::string::operator=((string *)&local_450,(string *)local_268);
    std::__cxx11::string::operator=((string *)&local_430,(string *)&local_248);
    std::__cxx11::string::operator=((string *)&local_410,(string *)local_228);
    if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
      operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_p != &local_238) {
      operator_delete(local_248._M_p,
                      CONCAT71(local_238._M_allocated_capacity._1_7_,local_238._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
      operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
    }
    logProgramData(pSVar36,(BuildInfo *)local_458,(ProgramContext *)local_618);
    cleanup(local_700,(EVP_PKEY_CTX *)local_c0);
    tcu::TestContext::setTestResult
              ((local_700->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Compilation failed");
  }
  else {
    setShaderInputs(local_700,dVar25,(ProgramContext *)local_618);
    draw(local_700);
    cleanup(local_700,(EVP_PKEY_CTX *)local_c0);
  }
  if (local_410._M_p != local_408 + 8) {
    operator_delete(local_410._M_p,CONCAT71(local_408._9_7_,local_408[8]) + 1);
  }
  pSVar36 = local_700;
  if (local_430._M_p != local_428 + 8) {
    operator_delete(local_430._M_p,CONCAT71(local_428._9_7_,local_428[8]) + 1);
  }
  if (local_450._M_p != local_448 + 8) {
    operator_delete(local_450._M_p,CONCAT71(local_448._9_7_,local_448[8]) + 1);
  }
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::~vector((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
             *)(local_5c8 + 8));
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ::~vector((vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
             *)local_5d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    operator_delete(local_5f8._M_dataplus._M_p,
                    CONCAT71(local_5f8.field_2._M_allocated_capacity._1_7_,
                             local_5f8.field_2._M_local_buf[0]) + 1);
  }
  if ((TestLog *)local_618._0_8_ != (TestLog *)(local_618 + 0x10)) {
    operator_delete((void *)local_618._0_8_,(ulong)(local_608._M_allocated_capacity + 1));
  }
  if (bVar31 != 0) {
    local_2d8.
    super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2d8.
    super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
    ._M_impl.super__Vector_impl_data._M_finish = (Measurement *)0x0;
    local_2d8.
    super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (Measurement *)0x0;
    local_268._0_8_ = local_268 + 0x10;
    local_268._8_8_ = (pointer)0x0;
    local_268._16_8_ = local_268._16_8_ & 0xffffffffffffff00;
    local_248._M_p = (pointer)&local_238;
    local_240 = 0;
    local_238._M_local_buf[0] = '\0';
    local_228._0_8_ = (pointer)0x0;
    local_228._8_8_ = (pointer)0x0;
    local_228._16_8_ = 0;
    vStack_210.
    super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_210.
    super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_210.
    super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    _Stack_b8._M_p = (pointer)&local_a8;
    local_b0 = (pointer)0x0;
    local_a8._M_local_buf[0] = '\0';
    local_98._M_allocated_capacity = (size_type)&local_88;
    local_98._8_8_ = 0;
    local_88._M_local_buf[0] = '\0';
    local_78._M_p = (pointer)&local_68;
    local_70 = 0;
    local_68._M_local_buf[0] = '\0';
    while( true ) {
      bVar10 = goodEnoughMeasurements(pSVar36,&local_2d8);
      if (bVar10) break;
      (*(pSVar36->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                ((string *)local_618,pSVar36,
                 (ulong)((long)local_2d8.
                               super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_2d8.
                              super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 6);
      SVar39 = createShadersAndProgram(pSVar36);
      local_748._M_dataplus._M_p._0_4_ = SVar39.vertShader;
      local_748._M_dataplus._M_p._4_4_ = SVar39.fragShader;
      local_748._M_string_length._0_4_ = SVar39.program;
      local_450._M_p = local_448 + 8;
      local_448._0_8_ = 0;
      local_448[8] = '\0';
      local_430._M_p = local_428 + 8;
      local_428._0_8_ = 0;
      local_428[8] = '\0';
      local_410._M_p = local_408 + 8;
      local_408._0_8_ = 0;
      local_408[8] = '\0';
      if (pSVar36->m_addWhitespaceAndComments == true) {
        uVar12 = ((uint)((ulong)((long)local_2d8.
                                       super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_2d8.
                                      super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 0x16) & 0xffff ^
                  (uint)((ulong)((long)local_2d8.
                                       super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_2d8.
                                      super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 6) ^ 0x3d) * 9;
        uVar12 = (uVar12 >> 4 ^ uVar12) * 0x27d4eb2d;
        uVar12 = uVar12 >> 0xf ^ pSVar36->m_startHash ^ uVar12;
        strWithWhiteSpaceAndComments((string *)local_680,(string *)local_618,uVar12);
        std::__cxx11::string::operator=((string *)local_618,(string *)local_680);
        if ((undefined1 *)local_680._0_8_ != local_680 + 0x10) {
          operator_delete((void *)local_680._0_8_,local_670._M_allocated_capacity + 1);
        }
        strWithWhiteSpaceAndComments((string *)local_680,&local_5f8,uVar12);
        std::__cxx11::string::operator=((string *)&local_5f8,(string *)local_680);
        if ((undefined1 *)local_680._0_8_ != local_680 + 0x10) {
          operator_delete((void *)local_680._0_8_,local_670._M_allocated_capacity + 1);
        }
      }
      tcu::warmupCPU();
      local_728 = (TestLog *)deGetMicroseconds();
      dVar4 = local_748._M_dataplus._M_p._4_4_;
      dVar25 = (deUint32)local_748._M_dataplus._M_p;
      iVar11 = (*((local_700->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      local_680._0_8_ = local_618._0_8_;
      local_7e8._M_dataplus._M_p = local_5f8._M_dataplus._M_p;
      (**(code **)(CONCAT44(extraout_var_02,iVar11) + 0x12b8))(dVar25,1,local_680,0);
      (**(code **)(CONCAT44(extraout_var_02,iVar11) + 0x12b8))(dVar4,1,&local_7e8,0);
      local_698 = (code *)deGetMicroseconds();
      pSVar36 = local_700;
      dVar25 = (deUint32)local_748._M_dataplus._M_p;
      iVar11 = (*((local_700->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      local_680._0_8_ = local_680._0_8_ & 0xffffffff00000000;
      (**(code **)(CONCAT44(extraout_var_03,iVar11) + 0x248))(dVar25);
      (**(code **)(CONCAT44(extraout_var_03,iVar11) + 0xa70))(dVar25,0x8b81,local_680);
      local_458[0] = (string)(local_680._0_4_ != 0);
      local_688 = deGetMicroseconds();
      dVar25 = local_748._M_dataplus._M_p._4_4_;
      iVar11 = (*((pSVar36->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      local_680._0_8_ = local_680._0_8_ & 0xffffffff00000000;
      (**(code **)(CONCAT44(extraout_var_04,iVar11) + 0x248))(dVar25);
      (**(code **)(CONCAT44(extraout_var_04,iVar11) + 0xa70))(dVar25,0x8b81,local_680);
      local_458[1] = local_680._0_4_ != 0;
      local_280 = deGetMicroseconds();
      bVar10 = linkAndUseProgram(local_700,(deUint32)local_748._M_string_length);
      bStack_456 = bVar10;
      dVar14 = deGetMicroseconds();
      pSVar36 = local_700;
      if (((local_458[0] != (string)0x1) || (local_458[1] != true)) || (bStack_456 == false)) {
        getLogs((Logs *)local_680,local_700,(ShadersAndProgram *)&local_748);
        std::__cxx11::string::operator=((string *)&local_450,(string *)local_680);
        std::__cxx11::string::operator=((string *)&local_430,(string *)&local_660);
        std::__cxx11::string::operator=((string *)&local_410,(string *)&local_640);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_640._M_p != &local_630) {
          operator_delete(local_640._M_p,local_630._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_660._M_p != &local_650) {
          operator_delete(local_660._M_p,local_650._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_680._0_8_ != local_680 + 0x10) {
          operator_delete((void *)local_680._0_8_,local_670._M_allocated_capacity + 1);
        }
        logProgramData(pSVar36,(BuildInfo *)local_458,(ProgramContext *)local_618);
        cleanup(pSVar36,(EVP_PKEY_CTX *)&local_748);
        tcu::TestContext::setTestResult
                  ((pSVar36->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Compilation failed");
        if (local_410._M_p != local_408 + 8) {
          operator_delete(local_410._M_p,CONCAT71(local_408._9_7_,local_408[8]) + 1);
        }
        if (local_430._M_p != local_428 + 8) {
          operator_delete(local_430._M_p,CONCAT71(local_428._9_7_,local_428[8]) + 1);
        }
        if (local_450._M_p != local_448 + 8) {
          operator_delete(local_450._M_p,CONCAT71(local_448._9_7_,local_448[8]) + 1);
        }
        std::
        vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
        ::~vector((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
                   *)(local_5c8 + 8));
        std::
        vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
        ::~vector((vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
                   *)local_5d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
          operator_delete(local_5f8._M_dataplus._M_p,
                          CONCAT71(local_5f8.field_2._M_allocated_capacity._1_7_,
                                   local_5f8.field_2._M_local_buf[0]) + 1);
        }
        if ((TestLog *)local_618._0_8_ == (TestLog *)(local_618 + 0x10)) goto LAB_0043d7f9;
        puVar32 = (undefined1 *)(local_608._M_allocated_capacity + 1);
        pTVar35 = (TestLog *)local_618._0_8_;
        goto LAB_0043d7f4;
      }
      setShaderInputs(local_700,(deUint32)local_748._M_string_length,(ProgramContext *)local_618);
      dVar15 = deGetMicroseconds();
      draw(local_700);
      dVar16 = deGetMicroseconds();
      setShaderInputs(local_700,(deUint32)local_748._M_string_length,(ProgramContext *)local_618);
      dVar17 = deGetMicroseconds();
      draw(local_700);
      dVar18 = deGetMicroseconds();
      getLogs((Logs *)local_680,local_700,(ShadersAndProgram *)&local_748);
      std::__cxx11::string::operator=((string *)&local_450,(string *)local_680);
      std::__cxx11::string::operator=((string *)&local_430,(string *)&local_660);
      std::__cxx11::string::operator=((string *)&local_410,(string *)&local_640);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_640._M_p != &local_630) {
        operator_delete(local_640._M_p,local_630._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_660._M_p != &local_650) {
        operator_delete(local_660._M_p,local_650._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_680._0_8_ != local_680 + 0x10) {
        operator_delete((void *)local_680._0_8_,local_670._M_allocated_capacity + 1);
      }
      cleanup(local_700,(EVP_PKEY_CTX *)&local_748);
      local_650._8_8_ = dVar18 - dVar17;
      local_650._M_allocated_capacity = dVar17 - dVar16;
      sStack_658 = dVar16 - dVar15;
      local_660._M_p = (pointer)(dVar15 - dVar14);
      local_670._8_8_ = dVar14 - local_280;
      local_670._M_allocated_capacity = local_280 - local_688;
      local_680._8_8_ = local_688 - (long)local_698;
      local_680._0_8_ = local_698 + -(long)local_728;
      if (local_2d8.
          super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_2d8.
          super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
        ::_M_realloc_insert<deqp::gles2::Performance::ShaderCompilerCase::Measurement>
                  (&local_2d8,
                   (iterator)
                   local_2d8.
                   super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(Measurement *)local_680);
      }
      else {
        (local_2d8.
         super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
         ._M_impl.super__Vector_impl_data._M_finish)->secondInputSetTime =
             local_650._M_allocated_capacity;
        (local_2d8.
         super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
         ._M_impl.super__Vector_impl_data._M_finish)->secondDrawTime = local_650._8_8_;
        (local_2d8.
         super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
         ._M_impl.super__Vector_impl_data._M_finish)->firstInputSetTime = (deInt64)local_660._M_p;
        (local_2d8.
         super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
         ._M_impl.super__Vector_impl_data._M_finish)->firstDrawTime = sStack_658;
        (local_2d8.
         super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
         ._M_impl.super__Vector_impl_data._M_finish)->fragmentCompileTime =
             local_670._M_allocated_capacity;
        (local_2d8.
         super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
         ._M_impl.super__Vector_impl_data._M_finish)->programLinkTime = local_670._8_8_;
        (local_2d8.
         super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
         ._M_impl.super__Vector_impl_data._M_finish)->sourceSetTime = local_680._0_8_;
        (local_2d8.
         super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
         ._M_impl.super__Vector_impl_data._M_finish)->vertexCompileTime = local_680._8_8_;
        local_2d8.
        super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_2d8.
             super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      local_c0._0_2_ = local_458;
      local_c0[2] = bStack_456;
      std::__cxx11::string::_M_assign((string *)&_Stack_b8);
      std::__cxx11::string::_M_assign((string *)local_98._M_local_buf);
      std::__cxx11::string::_M_assign((string *)&local_78);
      std::__cxx11::string::_M_assign((string *)local_268);
      std::__cxx11::string::_M_assign((string *)&local_248);
      std::
      vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
      ::operator=((vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
                   *)local_228,
                  (vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
                   *)local_5d8);
      std::
      vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
      ::operator=(&vStack_210,
                  (vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
                   *)(local_5c8 + 8));
      tcu::TestContext::touchWatchdog
                ((local_700->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      if (local_410._M_p != local_408 + 8) {
        operator_delete(local_410._M_p,CONCAT71(local_408._9_7_,local_408[8]) + 1);
      }
      pSVar36 = local_700;
      if (local_430._M_p != local_428 + 8) {
        operator_delete(local_430._M_p,CONCAT71(local_428._9_7_,local_428[8]) + 1);
      }
      if (local_450._M_p != local_448 + 8) {
        operator_delete(local_450._M_p,CONCAT71(local_448._9_7_,local_448[8]) + 1);
      }
      std::
      vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
      ::~vector((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
                 *)(local_5c8 + 8));
      std::
      vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
      ::~vector((vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
                 *)local_5d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
        operator_delete(local_5f8._M_dataplus._M_p,
                        CONCAT71(local_5f8.field_2._M_allocated_capacity._1_7_,
                                 local_5f8.field_2._M_local_buf[0]) + 1);
      }
      if ((TestLog *)local_618._0_8_ != (TestLog *)(local_618 + 0x10)) {
        operator_delete((void *)local_618._0_8_,(ulong)(local_608._M_allocated_capacity + 1));
      }
    }
    pTVar35 = ((pSVar36->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_118.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (long *)0x0;
    local_118.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_118.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (long *)0x0;
    local_138.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (long *)0x0;
    local_138.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_138.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (long *)0x0;
    local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (long *)0x0;
    local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (long *)0x0;
    local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (long *)0x0;
    local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (long *)0x0;
    local_198.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (long *)0x0;
    local_198.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_198.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (long *)0x0;
    local_1b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (long *)0x0;
    local_1b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_1b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (long *)0x0;
    local_1d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (long *)0x0;
    local_1d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_1d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (long *)0x0;
    local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (long *)0x0;
    local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (long *)0x0;
    local_d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (long *)0x0;
    local_d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (long *)0x0;
    local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (long *)0x0;
    local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (long *)0x0;
    local_2b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (long *)0x0;
    local_2b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_2b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (long *)0x0;
    local_298.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (long *)0x0;
    local_298.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_298.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (long *)0x0;
    if (pSVar36->m_avoidCache == false) {
      poVar1 = (ostringstream *)(local_618 + 8);
      local_618._0_8_ = pTVar35;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "Note: Testing cache hits, so the medians and averages exclude the first iteration."
                 ,0x52);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_618,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_5a0);
    }
    local_728 = pTVar35;
    _local_458 = (pointer)pTVar35;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_450);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_450,
               "Note: \"Specialization time\" means first draw time minus second draw time.",0x49);
    local_618._0_8_ =
         tcu::MessageBuilder::operator<<
                   ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
    poVar1 = (ostringstream *)(local_618 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Note: \"Compilation time\" means the time up to (and including) linking, plus specialization time."
               ,0x60);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_618,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_5a0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_450);
    std::ios_base::~ios_base(local_3e0);
    _local_458 = local_448;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"IterationMeasurements","");
    local_680._0_8_ = local_680 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_680,"Iteration measurements of compilation and linking times","");
    tcu::LogSection::LogSection((LogSection *)local_618,(string *)local_458,(string *)local_680);
    tcu::TestLog::startSection(local_728,(char *)local_618._0_8_,local_5f8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
      operator_delete(local_5f8._M_dataplus._M_p,
                      CONCAT71(local_5f8.field_2._M_allocated_capacity._1_7_,
                               local_5f8.field_2._M_local_buf[0]) + 1);
    }
    if ((TestLog *)local_618._0_8_ != (TestLog *)(local_618 + 0x10)) {
      operator_delete((void *)local_618._0_8_,(ulong)(local_608._M_allocated_capacity + 1));
    }
    if ((undefined1 *)local_680._0_8_ != local_680 + 0x10) {
      operator_delete((void *)local_680._0_8_,local_670._M_allocated_capacity + 1);
    }
    if (_local_458 != local_448) {
      operator_delete(_local_458,local_448._0_8_ + 1);
    }
    if (0 < (int)((ulong)((long)local_2d8.
                                super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_2d8.
                               super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 6)) {
      lVar37 = 0;
      local_698 = (code *)0x0;
      do {
        pMVar6 = local_2d8.
                 super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_270 = *(long *)((long)&(local_2d8.
                                      super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->secondDrawTime +
                             lVar37) +
                    *(long *)((long)&(local_2d8.
                                      super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->secondInputSetTime
                             + lVar37);
        lVar26 = *(long *)((long)&(local_2d8.
                                   super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->firstDrawTime +
                          lVar37) +
                 *(long *)((long)&(local_2d8.
                                   super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->firstInputSetTime +
                          lVar37);
        if (lVar26 <= local_270) {
          local_270 = lVar26;
        }
        local_270 = (*(long *)((long)&(local_2d8.
                                       super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->vertexCompileTime
                              + lVar37) +
                     *(long *)((long)&(local_2d8.
                                       super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->sourceSetTime +
                              lVar37) +
                     *(long *)((long)&(local_2d8.
                                       super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                      fragmentCompileTime + lVar37) +
                     *(long *)((long)&(local_2d8.
                                       super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->programLinkTime +
                              lVar37) + lVar26) - local_270;
        local_278 = *(long *)((long)&(local_2d8.
                                      super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->firstDrawTime +
                             lVar37) -
                    *(long *)((long)&(local_2d8.
                                      super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->secondDrawTime +
                             lVar37);
        if (local_278 < 1) {
          local_278 = 0;
        }
        if ((lVar37 != 0) || (local_700->m_avoidCache == true)) {
          plVar19 = (long *)((long)&(local_2d8.
                                     super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->sourceSetTime +
                            lVar37);
          if (local_118.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_118.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                      ((vector<long,std::allocator<long>> *)&local_118,
                       (iterator)
                       local_118.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish,plVar19);
          }
          else {
            *local_118.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish = *plVar19;
            local_118.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_118.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          plVar27 = (long *)((long)&pMVar6->vertexCompileTime + lVar37);
          if (local_138.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_138.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                      ((vector<long,std::allocator<long>> *)&local_138,
                       (iterator)
                       local_138.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish,plVar27);
          }
          else {
            *local_138.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish = *plVar27;
            local_138.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_138.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          plVar27 = (long *)((long)&pMVar6->fragmentCompileTime + lVar37);
          if (local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                      ((vector<long,std::allocator<long>> *)&local_158,
                       (iterator)
                       local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish,plVar27);
          }
          else {
            *local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish = *plVar27;
            local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          plVar27 = (long *)((long)&pMVar6->programLinkTime + lVar37);
          if (local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                      ((vector<long,std::allocator<long>> *)&local_178,
                       (iterator)
                       local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish,plVar27);
          }
          else {
            *local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish = *plVar27;
            local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          __args = (long *)((long)&pMVar6->firstInputSetTime + lVar37);
          if (local_198.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_198.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                      ((vector<long,std::allocator<long>> *)&local_198,
                       (iterator)
                       local_198.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish,__args);
          }
          else {
            *local_198.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish = *__args;
            local_198.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_198.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          __args_00 = (long *)((long)&pMVar6->firstDrawTime + lVar37);
          if (local_1b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_1b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                      ((vector<long,std::allocator<long>> *)&local_1b8,
                       (iterator)
                       local_1b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish,__args_00);
          }
          else {
            *local_1b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish = *__args_00;
            local_1b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_1b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_618._0_8_ = plVar19[1] + *plVar19 + plVar19[2] + *plVar27 + *__args + *__args_00;
          if (local_d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                      (&local_d8,
                       (iterator)
                       local_d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish,(long *)local_618);
          }
          else {
            *local_d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish = local_618._0_8_;
            local_d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_finish = local_d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
          }
          plVar19 = (long *)((long)&pMVar6->secondDrawTime + lVar37);
          if (local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                      ((vector<long,std::allocator<long>> *)&local_1f8,
                       (iterator)
                       local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish,plVar19);
          }
          else {
            *local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish = *plVar19;
            local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          plVar27 = (long *)((long)&pMVar6->secondInputSetTime + lVar37);
          if (local_1d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_1d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                      ((vector<long,std::allocator<long>> *)&local_1d8,
                       (iterator)
                       local_1d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish,plVar27);
          }
          else {
            *local_1d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish = *plVar27;
            local_1d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_1d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_618._0_8_ = *plVar19 + *plVar27;
          if (local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                      (&local_f8,
                       (iterator)
                       local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish,(long *)local_618);
          }
          else {
            *local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish = local_618._0_8_;
            local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_finish = local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
          }
          if (local_2b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_2b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                      ((vector<long,std::allocator<long>> *)&local_2b8,
                       (iterator)
                       local_2b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_270);
          }
          else {
            *local_2b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish = local_270;
            local_2b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_2b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          if (local_298.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_298.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                      ((vector<long,std::allocator<long>> *)&local_298,
                       (iterator)
                       local_298.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_278);
          }
          else {
            *local_298.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish = local_278;
            local_298.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_298.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_618);
        std::ostream::operator<<((ostringstream *)local_618,(int)local_698);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_618);
        std::ios_base::~ios_base(local_5a8);
        plVar19 = (long *)std::__cxx11::string::replace((ulong)&local_7c8,0,(char *)0x0,0x6750cf);
        local_7e8._M_dataplus._M_p = (pointer)&local_7e8.field_2;
        psVar22 = (size_type *)(plVar19 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar19 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar22) {
          local_7e8.field_2._M_allocated_capacity = *psVar22;
          local_7e8.field_2._8_8_ = plVar19[3];
        }
        else {
          local_7e8.field_2._M_allocated_capacity = *psVar22;
          local_7e8._M_dataplus._M_p = (pointer)*plVar19;
        }
        local_7e8._M_string_length = plVar19[1];
        *plVar19 = (long)psVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_7e8);
        local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
        psVar22 = (size_type *)(plVar19 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar19 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar22) {
          local_748.field_2._M_allocated_capacity = *psVar22;
          local_748.field_2._8_8_ = plVar19[3];
        }
        else {
          local_748.field_2._M_allocated_capacity = *psVar22;
          local_748._M_dataplus._M_p = (pointer)*plVar19;
        }
        local_748._M_string_length._0_4_ = (deUint32)plVar19[1];
        local_748._M_string_length._4_4_ = (undefined4)((ulong)plVar19[1] >> 0x20);
        *plVar19 = (long)psVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_618);
        std::ostream::operator<<((ostringstream *)local_618,(int)local_698);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_618);
        std::ios_base::~ios_base(local_5a8);
        plVar19 = (long *)std::__cxx11::string::replace((ulong)&local_7a8,0,(char *)0x0,0x6750eb);
        local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
        psVar22 = (size_type *)(plVar19 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar19 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar22) {
          local_768.field_2._M_allocated_capacity = *psVar22;
          local_768.field_2._8_8_ = plVar19[3];
        }
        else {
          local_768.field_2._M_allocated_capacity = *psVar22;
          local_768._M_dataplus._M_p = (pointer)*plVar19;
        }
        local_768._M_string_length = plVar19[1];
        *plVar19 = (long)psVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_768);
        local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
        psVar22 = (size_type *)(plVar19 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar19 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar22) {
          local_788.field_2._M_allocated_capacity = *psVar22;
          local_788.field_2._8_4_ = (undefined4)plVar19[3];
          local_788.field_2._12_4_ = *(undefined4 *)((long)plVar19 + 0x1c);
        }
        else {
          local_788.field_2._M_allocated_capacity = *psVar22;
          local_788._M_dataplus._M_p = (pointer)*plVar19;
        }
        local_788._M_string_length = plVar19[1];
        *plVar19 = (long)psVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_720,"ms","");
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)local_458,&local_748,&local_788,&local_720,QP_KEY_TAG_TIME,
                   (float)local_270 / 1000.0);
        tcu::TestLog::writeFloat
                  (local_728,_local_458,(char *)local_448._16_8_,(char *)local_428._16_8_,
                   local_408._16_4_,(float)local_408._20_4_);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_618);
        std::ostream::operator<<((ostringstream *)local_618,(int)local_698);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_618);
        std::ios_base::~ios_base(local_5a8);
        plVar19 = (long *)std::__cxx11::string::replace((ulong)&local_6b8,0,(char *)0x0,0x6750cf);
        local_6d8 = &local_6c8;
        plVar27 = plVar19 + 2;
        if ((long *)*plVar19 == plVar27) {
          local_6c8 = *plVar27;
          lStack_6c0 = plVar19[3];
        }
        else {
          local_6c8 = *plVar27;
          local_6d8 = (long *)*plVar19;
        }
        local_6d0 = plVar19[1];
        *plVar19 = (long)plVar27;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_6d8);
        local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
        psVar22 = (size_type *)(plVar19 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar19 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar22) {
          local_6f8.field_2._M_allocated_capacity = *psVar22;
          local_6f8.field_2._8_8_ = plVar19[3];
        }
        else {
          local_6f8.field_2._M_allocated_capacity = *psVar22;
          local_6f8._M_dataplus._M_p = (pointer)*plVar19;
        }
        local_6f8._M_string_length = plVar19[1];
        *plVar19 = (long)psVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_618);
        std::ostream::operator<<((ostringstream *)local_618,(int)local_698);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_618);
        std::ios_base::~ios_base(local_5a8);
        plVar19 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x6750eb);
        local_478.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)&local_478.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        plVar27 = plVar19 + 2;
        if ((pointer *)*plVar19 == (pointer *)plVar27) {
          local_478.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)*plVar27;
          lStack_460 = plVar19[3];
        }
        else {
          local_478.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)*plVar27;
          local_478.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)*plVar19;
        }
        local_478.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)plVar19[1];
        *plVar19 = (long)plVar27;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_478);
        local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
        psVar22 = (size_type *)(plVar19 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar19 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar22) {
          local_498.field_2._M_allocated_capacity = *psVar22;
          local_498.field_2._8_4_ = (undefined4)plVar19[3];
          local_498.field_2._12_4_ = *(undefined4 *)((long)plVar19 + 0x1c);
        }
        else {
          local_498.field_2._M_allocated_capacity = *psVar22;
          local_498._M_dataplus._M_p = (pointer)*plVar19;
        }
        local_498._M_string_length = plVar19[1];
        *plVar19 = (long)psVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        local_618._0_8_ = local_618 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_618,"ms","");
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)local_680,&local_6f8,&local_498,(string *)local_618,
                   QP_KEY_TAG_TIME,(float)local_278 / 1000.0);
        tcu::TestLog::writeFloat
                  (local_728,(char *)local_680._0_8_,local_660._M_p,local_640._M_p,local_620,
                   local_61c);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_640._M_p != &local_630) {
          operator_delete(local_640._M_p,local_630._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_660._M_p != &local_650) {
          operator_delete(local_660._M_p,local_650._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_680._0_8_ != local_680 + 0x10) {
          operator_delete((void *)local_680._0_8_,local_670._M_allocated_capacity + 1);
        }
        if ((TestLog *)local_618._0_8_ != (TestLog *)(local_618 + 0x10)) {
          operator_delete((void *)local_618._0_8_,(ulong)(local_608._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_dataplus._M_p != &local_498.field_2) {
          operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
        }
        if ((pointer *)
            local_478.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start !=
            &local_478.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_478.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_478.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage + 1);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
          operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
        }
        if (local_6d8 != &local_6c8) {
          operator_delete(local_6d8,local_6c8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
          operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_428._16_8_ != local_408) {
          operator_delete((void *)local_428._16_8_,local_408._0_8_ + 1);
        }
        if ((undefined1 *)local_448._16_8_ != local_428) {
          operator_delete((void *)local_448._16_8_,local_428._0_8_ + 1);
        }
        if (_local_458 != local_448) {
          operator_delete(_local_458,local_448._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_720._M_dataplus._M_p != &local_720.field_2) {
          operator_delete(local_720._M_dataplus._M_p,local_720.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_788._M_dataplus._M_p != &local_788.field_2) {
          operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_768._M_dataplus._M_p != &local_768.field_2) {
          operator_delete(local_768._M_dataplus._M_p,local_768.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
          operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_748._M_dataplus._M_p != &local_748.field_2) {
          operator_delete(local_748._M_dataplus._M_p,local_748.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7e8._M_dataplus._M_p != &local_7e8.field_2) {
          operator_delete(local_7e8._M_dataplus._M_p,local_7e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
          operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
        }
        local_698 = local_698 + 1;
        lVar37 = lVar37 + 0x40;
      } while ((long)local_698 <
               (long)(int)((ulong)((long)local_2d8.
                                         super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_2d8.
                                        super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 6));
    }
    paVar2 = &local_6f8.field_2;
    iVar11 = 0;
    do {
      pcVar33 = "LowestHalf";
      if (iVar11 == 0) {
        pcVar33 = "";
      }
      local_680._0_8_ = local_680 + 0x10;
      pcVar30 = pcVar33 + 10;
      if (iVar11 == 0) {
        pcVar30 = pcVar33;
      }
      std::__cxx11::string::_M_construct<char_const*>((string *)local_680,pcVar33,pcVar30);
      if (iVar11 == 0) {
        std::vector<long,_std::allocator<long>_>::vector
                  ((vector<long,_std::allocator<long>_> *)&local_498,&local_2b8);
        std::vector<long,_std::allocator<long>_>::vector(&local_478,&local_298);
      }
      else {
        vectorLowestPercentage<long>
                  ((vector<long,_std::allocator<long>_> *)&local_498,&local_2b8,0.5);
        vectorLowestPercentage<long>(&local_478,&local_298,0.5);
      }
      local_618._0_8_ = local_728;
      poVar1 = (ostringstream *)(local_618 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"\nStatistics computed from ",0x1a);
      pcVar33 = "only the lowest 50%";
      if (iVar11 == 0) {
        pcVar33 = "all";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,pcVar33,(ulong)(iVar11 != 0) << 4 | 3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_618 + 8)," of the above measurements:",0x1b);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_618,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_618 + 8));
      std::ios_base::~ios_base(local_5a0);
      local_7e8._M_dataplus._M_p = (pointer)&local_7e8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_7e8,local_680._0_8_,(pointer)(local_680._0_8_ + local_680._8_8_));
      std::__cxx11::string::append((char *)&local_7e8);
      plVar19 = (long *)std::__cxx11::string::append((char *)&local_7e8);
      local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_748.field_2._M_allocated_capacity = *psVar22;
        local_748.field_2._8_8_ = plVar19[3];
      }
      else {
        local_748.field_2._M_allocated_capacity = *psVar22;
        local_748._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_748._M_string_length._0_4_ = (deUint32)plVar19[1];
      local_748._M_string_length._4_4_ = (undefined4)((ulong)plVar19[1] >> 0x20);
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_788," of compilation time","");
      plVar19 = (long *)std::__cxx11::string::replace((ulong)&local_788,0,(char *)0x0,0x675161);
      local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_7c8.field_2._M_allocated_capacity = *psVar22;
        local_7c8.field_2._8_4_ = (undefined4)plVar19[3];
        local_7c8.field_2._12_4_ = *(undefined4 *)((long)plVar19 + 0x1c);
      }
      else {
        local_7c8.field_2._M_allocated_capacity = *psVar22;
        local_7c8._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_7c8._M_string_length = plVar19[1];
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"ms","");
      fVar38 = vectorFloatMedian<long>((vector<long,_std::allocator<long>_> *)&local_498);
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_618,&local_748,&local_7c8,&local_768,QP_KEY_TAG_TIME,
                 fVar38 / 1000.0);
      tcu::TestLog::writeFloat
                (local_728,(char *)local_618._0_8_,local_5f8._M_dataplus._M_p,
                 (char *)local_5d8._0_8_,local_5b8._M_allocated_capacity._0_4_,
                 (float)local_5b8._M_allocated_capacity._4_4_);
      local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_720,local_680._0_8_,(pointer)(local_680._0_8_ + local_680._8_8_));
      std::__cxx11::string::append((char *)&local_720);
      plVar19 = (long *)std::__cxx11::string::append((char *)&local_720);
      local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_7a8.field_2._M_allocated_capacity = *psVar22;
        local_7a8.field_2._8_4_ = (undefined4)plVar19[3];
        local_7a8.field_2._12_4_ = *(undefined4 *)((long)plVar19 + 0x1c);
      }
      else {
        local_7a8.field_2._M_allocated_capacity = *psVar22;
        local_7a8._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_7a8._M_string_length = plVar19[1];
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_6d8 = &local_6c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_6d8," of specialization time","");
      plVar19 = (long *)std::__cxx11::string::replace((ulong)&local_6d8,0,(char *)0x0,0x675161);
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_6f8.field_2._M_allocated_capacity = *psVar22;
        local_6f8.field_2._8_8_ = plVar19[3];
        local_6f8._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_6f8.field_2._M_allocated_capacity = *psVar22;
        local_6f8._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_6f8._M_string_length = plVar19[1];
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b8,"ms","");
      fVar38 = vectorFloatMedian<long>(&local_478);
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_458,&local_7a8,&local_6f8,&local_6b8,QP_KEY_TAG_TIME,
                 fVar38 / 1000.0);
      tcu::TestLog::writeFloat
                (local_728,_local_458,(char *)local_448._16_8_,(char *)local_428._16_8_,
                 local_408._16_4_,(float)local_408._20_4_);
      if ((undefined1 *)local_428._16_8_ != local_408) {
        operator_delete((void *)local_428._16_8_,local_408._0_8_ + 1);
      }
      if ((undefined1 *)local_448._16_8_ != local_428) {
        operator_delete((void *)local_448._16_8_,local_428._0_8_ + 1);
      }
      if (_local_458 != local_448) {
        operator_delete(_local_458,local_448._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
        operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f8._M_dataplus._M_p != paVar2) {
        operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
      }
      if (local_6d8 != &local_6c8) {
        operator_delete(local_6d8,local_6c8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
        operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_720._M_dataplus._M_p != &local_720.field_2) {
        operator_delete(local_720._M_dataplus._M_p,local_720.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_5d8._0_8_ != (pointer)local_5c8) {
        operator_delete((void *)local_5d8._0_8_,(ulong)(local_5c8._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
        operator_delete(local_5f8._M_dataplus._M_p,
                        CONCAT71(local_5f8.field_2._M_allocated_capacity._1_7_,
                                 local_5f8.field_2._M_local_buf[0]) + 1);
      }
      if ((TestLog *)local_618._0_8_ != (TestLog *)(local_618 + 0x10)) {
        operator_delete((void *)local_618._0_8_,(ulong)(local_608._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_768._M_dataplus._M_p != &local_768.field_2) {
        operator_delete(local_768._M_dataplus._M_p,local_768.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
        operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_788._M_dataplus._M_p != &local_788.field_2) {
        operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_748._M_dataplus._M_p != &local_748.field_2) {
        operator_delete(local_748._M_dataplus._M_p,local_748.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7e8._M_dataplus._M_p != &local_7e8.field_2) {
        operator_delete(local_7e8._M_dataplus._M_p,local_7e8.field_2._M_allocated_capacity + 1);
      }
      local_7e8._M_dataplus._M_p = (pointer)&local_7e8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_7e8,local_680._0_8_,(pointer)(local_680._0_8_ + local_680._8_8_));
      std::__cxx11::string::append((char *)&local_7e8);
      plVar19 = (long *)std::__cxx11::string::append((char *)&local_7e8);
      local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_748.field_2._M_allocated_capacity = *psVar22;
        local_748.field_2._8_8_ = plVar19[3];
      }
      else {
        local_748.field_2._M_allocated_capacity = *psVar22;
        local_748._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_748._M_string_length._0_4_ = (deUint32)plVar19[1];
      local_748._M_string_length._4_4_ = (undefined4)((ulong)plVar19[1] >> 0x20);
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_788," of compilation time","");
      plVar19 = (long *)std::__cxx11::string::replace((ulong)&local_788,0,(char *)0x0,0x675195);
      local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_7c8.field_2._M_allocated_capacity = *psVar22;
        local_7c8.field_2._8_4_ = (undefined4)plVar19[3];
        local_7c8.field_2._12_4_ = *(undefined4 *)((long)plVar19 + 0x1c);
      }
      else {
        local_7c8.field_2._M_allocated_capacity = *psVar22;
        local_7c8._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_7c8._M_string_length = plVar19[1];
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"ms","");
      uVar20 = (long)(local_498._M_string_length - (long)local_498._M_dataplus._M_p) >> 3;
      uVar12 = (uint)uVar20;
      if ((int)uVar12 < 1) {
        fVar38 = 0.0;
      }
      else {
        fVar38 = 0.0;
        uVar34 = 0;
        do {
          fVar38 = fVar38 + (float)*(long *)(local_498._M_dataplus._M_p + uVar34 * 8);
          uVar34 = uVar34 + 1;
        } while ((uVar12 & 0x7fffffff) != uVar34);
      }
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_618,&local_748,&local_7c8,&local_768,QP_KEY_TAG_TIME,
                 (fVar38 / (float)uVar20) / 1000.0);
      tcu::TestLog::writeFloat
                (local_728,(char *)local_618._0_8_,local_5f8._M_dataplus._M_p,
                 (char *)local_5d8._0_8_,local_5b8._M_allocated_capacity._0_4_,
                 (float)local_5b8._M_allocated_capacity._4_4_);
      local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_720,local_680._0_8_,(pointer)(local_680._0_8_ + local_680._8_8_));
      std::__cxx11::string::append((char *)&local_720);
      plVar19 = (long *)std::__cxx11::string::append((char *)&local_720);
      local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_7a8.field_2._M_allocated_capacity = *psVar22;
        local_7a8.field_2._8_4_ = (undefined4)plVar19[3];
        local_7a8.field_2._12_4_ = *(undefined4 *)((long)plVar19 + 0x1c);
      }
      else {
        local_7a8.field_2._M_allocated_capacity = *psVar22;
        local_7a8._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_7a8._M_string_length = plVar19[1];
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_6d8 = &local_6c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_6d8," of specialization time","");
      plVar19 = (long *)std::__cxx11::string::replace((ulong)&local_6d8,0,(char *)0x0,0x675195);
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_6f8.field_2._M_allocated_capacity = *psVar22;
        local_6f8.field_2._8_8_ = plVar19[3];
        local_6f8._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_6f8.field_2._M_allocated_capacity = *psVar22;
        local_6f8._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_6f8._M_string_length = plVar19[1];
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b8,"ms","");
      uVar20 = (long)local_478.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_478.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      uVar12 = (uint)uVar20;
      if ((int)uVar12 < 1) {
        fVar38 = 0.0;
      }
      else {
        fVar38 = 0.0;
        uVar34 = 0;
        do {
          fVar38 = fVar38 + (float)(long)local_478.super__Vector_base<long,_std::allocator<long>_>.
                                         _M_impl.super__Vector_impl_data._M_start[uVar34];
          uVar34 = uVar34 + 1;
        } while ((uVar12 & 0x7fffffff) != uVar34);
      }
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_458,&local_7a8,&local_6f8,&local_6b8,QP_KEY_TAG_TIME,
                 (fVar38 / (float)uVar20) / 1000.0);
      tcu::TestLog::writeFloat
                (local_728,_local_458,(char *)local_448._16_8_,(char *)local_428._16_8_,
                 local_408._16_4_,(float)local_408._20_4_);
      if ((undefined1 *)local_428._16_8_ != local_408) {
        operator_delete((void *)local_428._16_8_,local_408._0_8_ + 1);
      }
      if ((undefined1 *)local_448._16_8_ != local_428) {
        operator_delete((void *)local_448._16_8_,local_428._0_8_ + 1);
      }
      if (_local_458 != local_448) {
        operator_delete(_local_458,local_448._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
        operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f8._M_dataplus._M_p != paVar2) {
        operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
      }
      if (local_6d8 != &local_6c8) {
        operator_delete(local_6d8,local_6c8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
        operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_720._M_dataplus._M_p != &local_720.field_2) {
        operator_delete(local_720._M_dataplus._M_p,local_720.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_5d8._0_8_ != (pointer)local_5c8) {
        operator_delete((void *)local_5d8._0_8_,(ulong)(local_5c8._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
        operator_delete(local_5f8._M_dataplus._M_p,
                        CONCAT71(local_5f8.field_2._M_allocated_capacity._1_7_,
                                 local_5f8.field_2._M_local_buf[0]) + 1);
      }
      if ((TestLog *)local_618._0_8_ != (TestLog *)(local_618 + 0x10)) {
        operator_delete((void *)local_618._0_8_,(ulong)(local_608._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_768._M_dataplus._M_p != &local_768.field_2) {
        operator_delete(local_768._M_dataplus._M_p,local_768.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
        operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_788._M_dataplus._M_p != &local_788.field_2) {
        operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_748._M_dataplus._M_p != &local_748.field_2) {
        operator_delete(local_748._M_dataplus._M_p,local_748.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7e8._M_dataplus._M_p != &local_7e8.field_2) {
        operator_delete(local_7e8._M_dataplus._M_p,local_7e8.field_2._M_allocated_capacity + 1);
      }
      local_7e8._M_dataplus._M_p = (pointer)&local_7e8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_7e8,local_680._0_8_,(pointer)(local_680._0_8_ + local_680._8_8_));
      std::__cxx11::string::append((char *)&local_7e8);
      plVar19 = (long *)std::__cxx11::string::append((char *)&local_7e8);
      local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_748.field_2._M_allocated_capacity = *psVar22;
        local_748.field_2._8_8_ = plVar19[3];
      }
      else {
        local_748.field_2._M_allocated_capacity = *psVar22;
        local_748._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_748._M_string_length._0_4_ = (deUint32)plVar19[1];
      local_748._M_string_length._4_4_ = (undefined4)((ulong)plVar19[1] >> 0x20);
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_788," of compilation time","");
      plVar19 = (long *)std::__cxx11::string::replace((ulong)&local_788,0,(char *)0x0,0x67519d);
      local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_7c8.field_2._M_allocated_capacity = *psVar22;
        local_7c8.field_2._8_4_ = (undefined4)plVar19[3];
        local_7c8.field_2._12_4_ = *(undefined4 *)((long)plVar19 + 0x1c);
      }
      else {
        local_7c8.field_2._M_allocated_capacity = *psVar22;
        local_7c8._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_7c8._M_string_length = plVar19[1];
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"ms","");
      paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_498._M_dataplus._M_p + 8);
      _Var28._M_p = local_498._M_dataplus._M_p;
      if (paVar23 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._M_string_length &&
          local_498._M_dataplus._M_p != (pointer)local_498._M_string_length) {
        do {
          paVar9 = paVar23;
          if ((long)*(size_type *)_Var28._M_p <= (long)paVar23->_M_allocated_capacity) {
            paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)_Var28._M_p;
          }
          _Var28._M_p = (pointer)paVar9;
          paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar23->_M_allocated_capacity + 1);
        } while (paVar23 !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_498._M_string_length);
      }
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_618,&local_748,&local_7c8,&local_768,QP_KEY_TAG_TIME,
                 (float)(long)*(size_type *)_Var28._M_p / 1000.0);
      tcu::TestLog::writeFloat
                (local_728,(char *)local_618._0_8_,local_5f8._M_dataplus._M_p,
                 (char *)local_5d8._0_8_,local_5b8._M_allocated_capacity._0_4_,
                 (float)local_5b8._M_allocated_capacity._4_4_);
      local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_720,local_680._0_8_,(pointer)(local_680._0_8_ + local_680._8_8_));
      std::__cxx11::string::append((char *)&local_720);
      plVar19 = (long *)std::__cxx11::string::append((char *)&local_720);
      local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_7a8.field_2._M_allocated_capacity = *psVar22;
        local_7a8.field_2._8_4_ = (undefined4)plVar19[3];
        local_7a8.field_2._12_4_ = *(undefined4 *)((long)plVar19 + 0x1c);
      }
      else {
        local_7a8.field_2._M_allocated_capacity = *psVar22;
        local_7a8._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_7a8._M_string_length = plVar19[1];
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_6d8 = &local_6c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_6d8," of specialization time","");
      plVar19 = (long *)std::__cxx11::string::replace((ulong)&local_6d8,0,(char *)0x0,0x67519d);
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_6f8.field_2._M_allocated_capacity = *psVar22;
        local_6f8.field_2._8_8_ = plVar19[3];
        local_6f8._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_6f8.field_2._M_allocated_capacity = *psVar22;
        local_6f8._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_6f8._M_string_length = plVar19[1];
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b8,"ms","");
      pplVar24 = (pointer *)
                 (local_478.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start + 1);
      pplVar29 = (pointer *)
                 local_478.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if (pplVar24 !=
          (pointer *)
          local_478.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish &&
          local_478.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          local_478.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        do {
          pplVar8 = pplVar24;
          if ((long)*pplVar29 <= (long)*pplVar24) {
            pplVar8 = pplVar29;
          }
          pplVar29 = pplVar8;
          pplVar24 = pplVar24 + 1;
        } while (pplVar24 !=
                 (pointer *)
                 local_478.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_458,&local_7a8,&local_6f8,&local_6b8,QP_KEY_TAG_TIME,
                 (float)(long)*pplVar29 / 1000.0);
      tcu::TestLog::writeFloat
                (local_728,_local_458,(char *)local_448._16_8_,(char *)local_428._16_8_,
                 local_408._16_4_,(float)local_408._20_4_);
      if ((undefined1 *)local_428._16_8_ != local_408) {
        operator_delete((void *)local_428._16_8_,local_408._0_8_ + 1);
      }
      if ((undefined1 *)local_448._16_8_ != local_428) {
        operator_delete((void *)local_448._16_8_,local_428._0_8_ + 1);
      }
      if (_local_458 != local_448) {
        operator_delete(_local_458,local_448._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
        operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f8._M_dataplus._M_p != paVar2) {
        operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
      }
      if (local_6d8 != &local_6c8) {
        operator_delete(local_6d8,local_6c8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
        operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_720._M_dataplus._M_p != &local_720.field_2) {
        operator_delete(local_720._M_dataplus._M_p,local_720.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_5d8._0_8_ != (pointer)local_5c8) {
        operator_delete((void *)local_5d8._0_8_,(ulong)(local_5c8._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
        operator_delete(local_5f8._M_dataplus._M_p,
                        CONCAT71(local_5f8.field_2._M_allocated_capacity._1_7_,
                                 local_5f8.field_2._M_local_buf[0]) + 1);
      }
      if ((TestLog *)local_618._0_8_ != (TestLog *)(local_618 + 0x10)) {
        operator_delete((void *)local_618._0_8_,(ulong)(local_608._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_768._M_dataplus._M_p != &local_768.field_2) {
        operator_delete(local_768._M_dataplus._M_p,local_768.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
        operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_788._M_dataplus._M_p != &local_788.field_2) {
        operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_748._M_dataplus._M_p != &local_748.field_2) {
        operator_delete(local_748._M_dataplus._M_p,local_748.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7e8._M_dataplus._M_p != &local_7e8.field_2) {
        operator_delete(local_7e8._M_dataplus._M_p,local_7e8.field_2._M_allocated_capacity + 1);
      }
      local_7e8._M_dataplus._M_p = (pointer)&local_7e8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_7e8,local_680._0_8_,(pointer)(local_680._0_8_ + local_680._8_8_));
      std::__cxx11::string::append((char *)&local_7e8);
      plVar19 = (long *)std::__cxx11::string::append((char *)&local_7e8);
      local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_748.field_2._M_allocated_capacity = *psVar22;
        local_748.field_2._8_8_ = plVar19[3];
      }
      else {
        local_748.field_2._M_allocated_capacity = *psVar22;
        local_748._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_748._M_string_length._0_4_ = (deUint32)plVar19[1];
      local_748._M_string_length._4_4_ = (undefined4)((ulong)plVar19[1] >> 0x20);
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_788," of compilation time","");
      plVar19 = (long *)std::__cxx11::string::replace((ulong)&local_788,0,(char *)0x0,0x6751a5);
      local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_7c8.field_2._M_allocated_capacity = *psVar22;
        local_7c8.field_2._8_4_ = (undefined4)plVar19[3];
        local_7c8.field_2._12_4_ = *(undefined4 *)((long)plVar19 + 0x1c);
      }
      else {
        local_7c8.field_2._M_allocated_capacity = *psVar22;
        local_7c8._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_7c8._M_string_length = plVar19[1];
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"ms","");
      paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_498._M_dataplus._M_p + 8);
      _Var28._M_p = local_498._M_dataplus._M_p;
      if (paVar23 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._M_string_length &&
          local_498._M_dataplus._M_p != (pointer)local_498._M_string_length) {
        do {
          paVar9 = paVar23;
          if ((long)paVar23->_M_allocated_capacity <= (long)*(size_type *)_Var28._M_p) {
            paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)_Var28._M_p;
          }
          _Var28._M_p = (pointer)paVar9;
          paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar23->_M_allocated_capacity + 1);
        } while (paVar23 !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_498._M_string_length);
      }
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_618,&local_748,&local_7c8,&local_768,QP_KEY_TAG_TIME,
                 (float)(long)*(size_type *)_Var28._M_p / 1000.0);
      tcu::TestLog::writeFloat
                (local_728,(char *)local_618._0_8_,local_5f8._M_dataplus._M_p,
                 (char *)local_5d8._0_8_,local_5b8._M_allocated_capacity._0_4_,
                 (float)local_5b8._M_allocated_capacity._4_4_);
      local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_720,local_680._0_8_,(pointer)(local_680._0_8_ + local_680._8_8_));
      std::__cxx11::string::append((char *)&local_720);
      plVar19 = (long *)std::__cxx11::string::append((char *)&local_720);
      local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_7a8.field_2._M_allocated_capacity = *psVar22;
        local_7a8.field_2._8_4_ = (undefined4)plVar19[3];
        local_7a8.field_2._12_4_ = *(undefined4 *)((long)plVar19 + 0x1c);
      }
      else {
        local_7a8.field_2._M_allocated_capacity = *psVar22;
        local_7a8._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_7a8._M_string_length = plVar19[1];
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_6d8 = &local_6c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_6d8," of specialization time","");
      plVar19 = (long *)std::__cxx11::string::replace((ulong)&local_6d8,0,(char *)0x0,0x6751a5);
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_6f8.field_2._M_allocated_capacity = *psVar22;
        local_6f8.field_2._8_8_ = plVar19[3];
        local_6f8._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_6f8.field_2._M_allocated_capacity = *psVar22;
        local_6f8._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_6f8._M_string_length = plVar19[1];
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b8,"ms","");
      pplVar24 = (pointer *)
                 (local_478.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start + 1);
      pplVar29 = (pointer *)
                 local_478.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if (pplVar24 !=
          (pointer *)
          local_478.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish &&
          local_478.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          local_478.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        do {
          pplVar8 = pplVar24;
          if ((long)*pplVar24 <= (long)*pplVar29) {
            pplVar8 = pplVar29;
          }
          pplVar29 = pplVar8;
          pplVar24 = pplVar24 + 1;
        } while (pplVar24 !=
                 (pointer *)
                 local_478.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_458,&local_7a8,&local_6f8,&local_6b8,QP_KEY_TAG_TIME,
                 (float)(long)*pplVar29 / 1000.0);
      tcu::TestLog::writeFloat
                (local_728,_local_458,(char *)local_448._16_8_,(char *)local_428._16_8_,
                 local_408._16_4_,(float)local_408._20_4_);
      if ((undefined1 *)local_428._16_8_ != local_408) {
        operator_delete((void *)local_428._16_8_,local_408._0_8_ + 1);
      }
      if ((undefined1 *)local_448._16_8_ != local_428) {
        operator_delete((void *)local_448._16_8_,local_428._0_8_ + 1);
      }
      if (_local_458 != local_448) {
        operator_delete(_local_458,local_448._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
        operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f8._M_dataplus._M_p != paVar2) {
        operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
      }
      if (local_6d8 != &local_6c8) {
        operator_delete(local_6d8,local_6c8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
        operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_720._M_dataplus._M_p != &local_720.field_2) {
        operator_delete(local_720._M_dataplus._M_p,local_720.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_5d8._0_8_ != (pointer)local_5c8) {
        operator_delete((void *)local_5d8._0_8_,(ulong)(local_5c8._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
        operator_delete(local_5f8._M_dataplus._M_p,
                        CONCAT71(local_5f8.field_2._M_allocated_capacity._1_7_,
                                 local_5f8.field_2._M_local_buf[0]) + 1);
      }
      if ((TestLog *)local_618._0_8_ != (TestLog *)(local_618 + 0x10)) {
        operator_delete((void *)local_618._0_8_,(ulong)(local_608._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_768._M_dataplus._M_p != &local_768.field_2) {
        operator_delete(local_768._M_dataplus._M_p,local_768.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
        operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_788._M_dataplus._M_p != &local_788.field_2) {
        operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_748._M_dataplus._M_p != &local_748.field_2) {
        operator_delete(local_748._M_dataplus._M_p,local_748.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7e8._M_dataplus._M_p != &local_7e8.field_2) {
        operator_delete(local_7e8._M_dataplus._M_p,local_7e8.field_2._M_allocated_capacity + 1);
      }
      local_7e8._M_dataplus._M_p = (pointer)&local_7e8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_7e8,local_680._0_8_,(pointer)(local_680._0_8_ + local_680._8_8_));
      std::__cxx11::string::append((char *)&local_7e8);
      plVar19 = (long *)std::__cxx11::string::append((char *)&local_7e8);
      local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_748.field_2._M_allocated_capacity = *psVar22;
        local_748.field_2._8_8_ = plVar19[3];
      }
      else {
        local_748.field_2._M_allocated_capacity = *psVar22;
        local_748._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_748._M_string_length._0_4_ = (deUint32)plVar19[1];
      local_748._M_string_length._4_4_ = (undefined4)((ulong)plVar19[1] >> 0x20);
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_788," of compilation time","");
      plVar19 = (long *)std::__cxx11::string::replace((ulong)&local_788,0,(char *)0x0,0x6751ad);
      local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_7c8.field_2._M_allocated_capacity = *psVar22;
        local_7c8.field_2._8_4_ = (undefined4)plVar19[3];
        local_7c8.field_2._12_4_ = *(undefined4 *)((long)plVar19 + 0x1c);
      }
      else {
        local_7c8.field_2._M_allocated_capacity = *psVar22;
        local_7c8._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_7c8._M_string_length = plVar19[1];
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"ms","");
      fVar38 = vectorFloatMedianAbsoluteDeviation<long>
                         ((vector<long,_std::allocator<long>_> *)&local_498);
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_618,&local_748,&local_7c8,&local_768,QP_KEY_TAG_TIME,
                 fVar38 / 1000.0);
      tcu::TestLog::writeFloat
                (local_728,(char *)local_618._0_8_,local_5f8._M_dataplus._M_p,
                 (char *)local_5d8._0_8_,local_5b8._M_allocated_capacity._0_4_,
                 (float)local_5b8._M_allocated_capacity._4_4_);
      local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_720,local_680._0_8_,(pointer)(local_680._0_8_ + local_680._8_8_));
      std::__cxx11::string::append((char *)&local_720);
      plVar19 = (long *)std::__cxx11::string::append((char *)&local_720);
      local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_7a8.field_2._M_allocated_capacity = *psVar22;
        local_7a8.field_2._8_4_ = (undefined4)plVar19[3];
        local_7a8.field_2._12_4_ = *(undefined4 *)((long)plVar19 + 0x1c);
      }
      else {
        local_7a8.field_2._M_allocated_capacity = *psVar22;
        local_7a8._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_7a8._M_string_length = plVar19[1];
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_6d8 = &local_6c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_6d8," of specialization time","");
      plVar19 = (long *)std::__cxx11::string::replace((ulong)&local_6d8,0,(char *)0x0,0x6751ad);
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_6f8.field_2._M_allocated_capacity = *psVar22;
        local_6f8.field_2._8_8_ = plVar19[3];
        local_6f8._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_6f8.field_2._M_allocated_capacity = *psVar22;
        local_6f8._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_6f8._M_string_length = plVar19[1];
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b8,"ms","");
      fVar38 = vectorFloatMedianAbsoluteDeviation<long>(&local_478);
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_458,&local_7a8,&local_6f8,&local_6b8,QP_KEY_TAG_TIME,
                 fVar38 / 1000.0);
      tcu::TestLog::writeFloat
                (local_728,_local_458,(char *)local_448._16_8_,(char *)local_428._16_8_,
                 local_408._16_4_,(float)local_408._20_4_);
      if ((undefined1 *)local_428._16_8_ != local_408) {
        operator_delete((void *)local_428._16_8_,local_408._0_8_ + 1);
      }
      if ((undefined1 *)local_448._16_8_ != local_428) {
        operator_delete((void *)local_448._16_8_,local_428._0_8_ + 1);
      }
      if (_local_458 != local_448) {
        operator_delete(_local_458,local_448._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
        operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f8._M_dataplus._M_p != paVar2) {
        operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
      }
      if (local_6d8 != &local_6c8) {
        operator_delete(local_6d8,local_6c8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
        operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_720._M_dataplus._M_p != &local_720.field_2) {
        operator_delete(local_720._M_dataplus._M_p,local_720.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_5d8._0_8_ != (pointer)local_5c8) {
        operator_delete((void *)local_5d8._0_8_,(ulong)(local_5c8._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
        operator_delete(local_5f8._M_dataplus._M_p,
                        CONCAT71(local_5f8.field_2._M_allocated_capacity._1_7_,
                                 local_5f8.field_2._M_local_buf[0]) + 1);
      }
      if ((TestLog *)local_618._0_8_ != (TestLog *)(local_618 + 0x10)) {
        operator_delete((void *)local_618._0_8_,(ulong)(local_608._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_768._M_dataplus._M_p != &local_768.field_2) {
        operator_delete(local_768._M_dataplus._M_p,local_768.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
        operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_788._M_dataplus._M_p != &local_788.field_2) {
        operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_748._M_dataplus._M_p != &local_748.field_2) {
        operator_delete(local_748._M_dataplus._M_p,local_748.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7e8._M_dataplus._M_p != &local_7e8.field_2) {
        operator_delete(local_7e8._M_dataplus._M_p,local_7e8.field_2._M_allocated_capacity + 1);
      }
      local_7e8._M_dataplus._M_p = (pointer)&local_7e8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_7e8,local_680._0_8_,(pointer)(local_680._0_8_ + local_680._8_8_));
      std::__cxx11::string::append((char *)&local_7e8);
      plVar19 = (long *)std::__cxx11::string::append((char *)&local_7e8);
      local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_748.field_2._M_allocated_capacity = *psVar22;
        local_748.field_2._8_8_ = plVar19[3];
      }
      else {
        local_748.field_2._M_allocated_capacity = *psVar22;
        local_748._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_748._M_string_length._0_4_ = (deUint32)plVar19[1];
      local_748._M_string_length._4_4_ = (undefined4)((ulong)plVar19[1] >> 0x20);
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_788," of compilation time","");
      plVar19 = (long *)std::__cxx11::string::replace((ulong)&local_788,0,(char *)0x0,0x6751e7);
      local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_7c8.field_2._M_allocated_capacity = *psVar22;
        local_7c8.field_2._8_4_ = (undefined4)plVar19[3];
        local_7c8.field_2._12_4_ = *(undefined4 *)((long)plVar19 + 0x1c);
      }
      else {
        local_7c8.field_2._M_allocated_capacity = *psVar22;
        local_7c8._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_7c8._M_string_length = plVar19[1];
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"");
      fVar38 = vectorFloatMedianAbsoluteDeviation<long>
                         ((vector<long,_std::allocator<long>_> *)&local_498);
      local_698 = (code *)CONCAT44(extraout_XMM0_Db,fVar38);
      fVar38 = vectorFloatMedian<long>((vector<long,_std::allocator<long>_> *)&local_498);
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_618,&local_748,&local_7c8,&local_768,QP_KEY_TAG_NONE,
                 (float)(~-(uint)(fVar38 == 0.0) & (uint)((float)local_698 / fVar38)));
      tcu::TestLog::writeFloat
                (local_728,(char *)local_618._0_8_,local_5f8._M_dataplus._M_p,
                 (char *)local_5d8._0_8_,local_5b8._M_allocated_capacity._0_4_,
                 (float)local_5b8._M_allocated_capacity._4_4_);
      local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_720,local_680._0_8_,(pointer)(local_680._0_8_ + local_680._8_8_));
      std::__cxx11::string::append((char *)&local_720);
      plVar19 = (long *)std::__cxx11::string::append((char *)&local_720);
      local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_7a8.field_2._M_allocated_capacity = *psVar22;
        local_7a8.field_2._8_4_ = (undefined4)plVar19[3];
        local_7a8.field_2._12_4_ = *(undefined4 *)((long)plVar19 + 0x1c);
      }
      else {
        local_7a8.field_2._M_allocated_capacity = *psVar22;
        local_7a8._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_7a8._M_string_length = plVar19[1];
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_6d8 = &local_6c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_6d8," of specialization time","");
      plVar19 = (long *)std::__cxx11::string::replace((ulong)&local_6d8,0,(char *)0x0,0x6751e7);
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_6f8.field_2._M_allocated_capacity = *psVar22;
        local_6f8.field_2._8_8_ = plVar19[3];
        local_6f8._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_6f8.field_2._M_allocated_capacity = *psVar22;
        local_6f8._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_6f8._M_string_length = plVar19[1];
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b8,"");
      fVar38 = vectorFloatMedianAbsoluteDeviation<long>(&local_478);
      local_698 = (code *)CONCAT44(extraout_XMM0_Db_00,fVar38);
      fVar38 = vectorFloatMedian<long>(&local_478);
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_458,&local_7a8,&local_6f8,&local_6b8,QP_KEY_TAG_NONE,
                 (float)(~-(uint)(fVar38 == 0.0) & (uint)((float)local_698 / fVar38)));
      tcu::TestLog::writeFloat
                (local_728,_local_458,(char *)local_448._16_8_,(char *)local_428._16_8_,
                 local_408._16_4_,(float)local_408._20_4_);
      if ((undefined1 *)local_428._16_8_ != local_408) {
        operator_delete((void *)local_428._16_8_,local_408._0_8_ + 1);
      }
      if ((undefined1 *)local_448._16_8_ != local_428) {
        operator_delete((void *)local_448._16_8_,local_428._0_8_ + 1);
      }
      if (_local_458 != local_448) {
        operator_delete(_local_458,local_448._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
        operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f8._M_dataplus._M_p != paVar2) {
        operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
      }
      if (local_6d8 != &local_6c8) {
        operator_delete(local_6d8,local_6c8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
        operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_720._M_dataplus._M_p != &local_720.field_2) {
        operator_delete(local_720._M_dataplus._M_p,local_720.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_5d8._0_8_ != (pointer)local_5c8) {
        operator_delete((void *)local_5d8._0_8_,(ulong)(local_5c8._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
        operator_delete(local_5f8._M_dataplus._M_p,
                        CONCAT71(local_5f8.field_2._M_allocated_capacity._1_7_,
                                 local_5f8.field_2._M_local_buf[0]) + 1);
      }
      if ((TestLog *)local_618._0_8_ != (TestLog *)(local_618 + 0x10)) {
        operator_delete((void *)local_618._0_8_,(ulong)(local_608._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_768._M_dataplus._M_p != &local_768.field_2) {
        operator_delete(local_768._M_dataplus._M_p,local_768.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
        operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_788._M_dataplus._M_p != &local_788.field_2) {
        operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_748._M_dataplus._M_p != &local_748.field_2) {
        operator_delete(local_748._M_dataplus._M_p,local_748.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7e8._M_dataplus._M_p != &local_7e8.field_2) {
        operator_delete(local_7e8._M_dataplus._M_p,local_7e8.field_2._M_allocated_capacity + 1);
      }
      local_7e8._M_dataplus._M_p = (pointer)&local_7e8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_7e8,local_680._0_8_,(pointer)(local_680._0_8_ + local_680._8_8_));
      std::__cxx11::string::append((char *)&local_7e8);
      plVar19 = (long *)std::__cxx11::string::append((char *)&local_7e8);
      local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_748.field_2._M_allocated_capacity = *psVar22;
        local_748.field_2._8_8_ = plVar19[3];
      }
      else {
        local_748.field_2._M_allocated_capacity = *psVar22;
        local_748._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_748._M_string_length._0_4_ = (deUint32)plVar19[1];
      local_748._M_string_length._4_4_ = (undefined4)((ulong)plVar19[1] >> 0x20);
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_788," of compilation time","");
      plVar19 = (long *)std::__cxx11::string::replace((ulong)&local_788,0,(char *)0x0,0x67520a);
      local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_7c8.field_2._M_allocated_capacity = *psVar22;
        local_7c8.field_2._8_4_ = (undefined4)plVar19[3];
        local_7c8.field_2._12_4_ = *(undefined4 *)((long)plVar19 + 0x1c);
      }
      else {
        local_7c8.field_2._M_allocated_capacity = *psVar22;
        local_7c8._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_7c8._M_string_length = plVar19[1];
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"ms","");
      fVar38 = vectorFloatStandardDeviation<long>((vector<long,_std::allocator<long>_> *)&local_498)
      ;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_618,&local_748,&local_7c8,&local_768,QP_KEY_TAG_TIME,
                 fVar38 / 1000.0);
      tcu::TestLog::writeFloat
                (local_728,(char *)local_618._0_8_,local_5f8._M_dataplus._M_p,
                 (char *)local_5d8._0_8_,local_5b8._M_allocated_capacity._0_4_,
                 (float)local_5b8._M_allocated_capacity._4_4_);
      local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_720,local_680._0_8_,(pointer)(local_680._0_8_ + local_680._8_8_));
      std::__cxx11::string::append((char *)&local_720);
      plVar19 = (long *)std::__cxx11::string::append((char *)&local_720);
      local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_7a8.field_2._M_allocated_capacity = *psVar22;
        local_7a8.field_2._8_4_ = (undefined4)plVar19[3];
        local_7a8.field_2._12_4_ = *(undefined4 *)((long)plVar19 + 0x1c);
      }
      else {
        local_7a8.field_2._M_allocated_capacity = *psVar22;
        local_7a8._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_7a8._M_string_length = plVar19[1];
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_6d8 = &local_6c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_6d8," of specialization time","");
      plVar19 = (long *)std::__cxx11::string::replace((ulong)&local_6d8,0,(char *)0x0,0x67520a);
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_6f8.field_2._M_allocated_capacity = *psVar22;
        local_6f8.field_2._8_8_ = plVar19[3];
        local_6f8._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_6f8.field_2._M_allocated_capacity = *psVar22;
        local_6f8._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_6f8._M_string_length = plVar19[1];
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b8,"ms","");
      fVar38 = vectorFloatStandardDeviation<long>(&local_478);
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_458,&local_7a8,&local_6f8,&local_6b8,QP_KEY_TAG_TIME,
                 fVar38 / 1000.0);
      tcu::TestLog::writeFloat
                (local_728,_local_458,(char *)local_448._16_8_,(char *)local_428._16_8_,
                 local_408._16_4_,(float)local_408._20_4_);
      if ((undefined1 *)local_428._16_8_ != local_408) {
        operator_delete((void *)local_428._16_8_,local_408._0_8_ + 1);
      }
      if ((undefined1 *)local_448._16_8_ != local_428) {
        operator_delete((void *)local_448._16_8_,local_428._0_8_ + 1);
      }
      if (_local_458 != local_448) {
        operator_delete(_local_458,local_448._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
        operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f8._M_dataplus._M_p != paVar2) {
        operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
      }
      if (local_6d8 != &local_6c8) {
        operator_delete(local_6d8,local_6c8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
        operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_720._M_dataplus._M_p != &local_720.field_2) {
        operator_delete(local_720._M_dataplus._M_p,local_720.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_5d8._0_8_ != (pointer)local_5c8) {
        operator_delete((void *)local_5d8._0_8_,(ulong)(local_5c8._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
        operator_delete(local_5f8._M_dataplus._M_p,
                        CONCAT71(local_5f8.field_2._M_allocated_capacity._1_7_,
                                 local_5f8.field_2._M_local_buf[0]) + 1);
      }
      if ((TestLog *)local_618._0_8_ != (TestLog *)(local_618 + 0x10)) {
        operator_delete((void *)local_618._0_8_,(ulong)(local_608._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_768._M_dataplus._M_p != &local_768.field_2) {
        operator_delete(local_768._M_dataplus._M_p,local_768.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
        operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_788._M_dataplus._M_p != &local_788.field_2) {
        operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_748._M_dataplus._M_p != &local_748.field_2) {
        operator_delete(local_748._M_dataplus._M_p,local_748.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7e8._M_dataplus._M_p != &local_7e8.field_2) {
        operator_delete(local_7e8._M_dataplus._M_p,local_7e8.field_2._M_allocated_capacity + 1);
      }
      local_7e8._M_dataplus._M_p = (pointer)&local_7e8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_7e8,local_680._0_8_,(pointer)(local_680._0_8_ + local_680._8_8_));
      std::__cxx11::string::append((char *)&local_7e8);
      plVar19 = (long *)std::__cxx11::string::append((char *)&local_7e8);
      local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_748.field_2._M_allocated_capacity = *psVar22;
        local_748.field_2._8_8_ = plVar19[3];
      }
      else {
        local_748.field_2._M_allocated_capacity = *psVar22;
        local_748._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_748._M_string_length._0_4_ = (deUint32)plVar19[1];
      local_748._M_string_length._4_4_ = (undefined4)((ulong)plVar19[1] >> 0x20);
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_788," of compilation time","");
      plVar19 = (long *)std::__cxx11::string::replace((ulong)&local_788,0,(char *)0x0,0x675237);
      local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_7c8.field_2._M_allocated_capacity = *psVar22;
        local_7c8.field_2._8_4_ = (undefined4)plVar19[3];
        local_7c8.field_2._12_4_ = *(undefined4 *)((long)plVar19 + 0x1c);
      }
      else {
        local_7c8.field_2._M_allocated_capacity = *psVar22;
        local_7c8._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_7c8._M_string_length = plVar19[1];
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"");
      fVar38 = vectorFloatRelativeStandardDeviation<long>
                         ((vector<long,_std::allocator<long>_> *)&local_498);
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_618,&local_748,&local_7c8,&local_768,QP_KEY_TAG_NONE,
                 fVar38);
      tcu::TestLog::writeFloat
                (local_728,(char *)local_618._0_8_,local_5f8._M_dataplus._M_p,
                 (char *)local_5d8._0_8_,local_5b8._M_allocated_capacity._0_4_,
                 (float)local_5b8._M_allocated_capacity._4_4_);
      local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_720,local_680._0_8_,(pointer)(local_680._0_8_ + local_680._8_8_));
      std::__cxx11::string::append((char *)&local_720);
      plVar19 = (long *)std::__cxx11::string::append((char *)&local_720);
      local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_7a8.field_2._M_allocated_capacity = *psVar22;
        local_7a8.field_2._8_4_ = (undefined4)plVar19[3];
        local_7a8.field_2._12_4_ = *(undefined4 *)((long)plVar19 + 0x1c);
      }
      else {
        local_7a8.field_2._M_allocated_capacity = *psVar22;
        local_7a8._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_7a8._M_string_length = plVar19[1];
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_6d8 = &local_6c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_6d8," of specialization time","");
      plVar19 = (long *)std::__cxx11::string::replace((ulong)&local_6d8,0,(char *)0x0,0x675237);
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_6f8.field_2._M_allocated_capacity = *psVar22;
        local_6f8.field_2._8_8_ = plVar19[3];
        local_6f8._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_6f8.field_2._M_allocated_capacity = *psVar22;
        local_6f8._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_6f8._M_string_length = plVar19[1];
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b8,"");
      fVar38 = vectorFloatRelativeStandardDeviation<long>(&local_478);
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_458,&local_7a8,&local_6f8,&local_6b8,QP_KEY_TAG_NONE,
                 fVar38);
      tcu::TestLog::writeFloat
                (local_728,_local_458,(char *)local_448._16_8_,(char *)local_428._16_8_,
                 local_408._16_4_,(float)local_408._20_4_);
      if ((undefined1 *)local_428._16_8_ != local_408) {
        operator_delete((void *)local_428._16_8_,local_408._0_8_ + 1);
      }
      if ((undefined1 *)local_448._16_8_ != local_428) {
        operator_delete((void *)local_448._16_8_,local_428._0_8_ + 1);
      }
      if (_local_458 != local_448) {
        operator_delete(_local_458,local_448._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
        operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f8._M_dataplus._M_p != paVar2) {
        operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
      }
      if (local_6d8 != &local_6c8) {
        operator_delete(local_6d8,local_6c8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
        operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_720._M_dataplus._M_p != &local_720.field_2) {
        operator_delete(local_720._M_dataplus._M_p,local_720.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_5d8._0_8_ != (pointer)local_5c8) {
        operator_delete((void *)local_5d8._0_8_,(ulong)(local_5c8._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
        operator_delete(local_5f8._M_dataplus._M_p,
                        CONCAT71(local_5f8.field_2._M_allocated_capacity._1_7_,
                                 local_5f8.field_2._M_local_buf[0]) + 1);
      }
      if ((TestLog *)local_618._0_8_ != (TestLog *)(local_618 + 0x10)) {
        operator_delete((void *)local_618._0_8_,(ulong)(local_608._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_768._M_dataplus._M_p != &local_768.field_2) {
        operator_delete(local_768._M_dataplus._M_p,local_768.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
        operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_788._M_dataplus._M_p != &local_788.field_2) {
        operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_748._M_dataplus._M_p != &local_748.field_2) {
        operator_delete(local_748._M_dataplus._M_p,local_748.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7e8._M_dataplus._M_p != &local_7e8.field_2) {
        operator_delete(local_7e8._M_dataplus._M_p,local_7e8.field_2._M_allocated_capacity + 1);
      }
      local_7e8._M_dataplus._M_p = (pointer)&local_7e8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_7e8,local_680._0_8_,(pointer)(local_680._0_8_ + local_680._8_8_));
      std::__cxx11::string::append((char *)&local_7e8);
      plVar19 = (long *)std::__cxx11::string::append((char *)&local_7e8);
      local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_748.field_2._M_allocated_capacity = *psVar22;
        local_748.field_2._8_8_ = plVar19[3];
      }
      else {
        local_748.field_2._M_allocated_capacity = *psVar22;
        local_748._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_748._M_string_length._0_4_ = (deUint32)plVar19[1];
      local_748._M_string_length._4_4_ = (undefined4)((ulong)plVar19[1] >> 0x20);
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_788," of compilation time","");
      plVar19 = (long *)std::__cxx11::string::replace((ulong)&local_788,0,(char *)0x0,0x675253);
      local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_7c8.field_2._M_allocated_capacity = *psVar22;
        local_7c8.field_2._8_4_ = (undefined4)plVar19[3];
        local_7c8.field_2._12_4_ = *(undefined4 *)((long)plVar19 + 0x1c);
      }
      else {
        local_7c8.field_2._M_allocated_capacity = *psVar22;
        local_7c8._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_7c8._M_string_length = plVar19[1];
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"ms","");
      fVar38 = vectorFloatMaximumMinusMinimum<long>
                         ((vector<long,_std::allocator<long>_> *)&local_498);
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_618,&local_748,&local_7c8,&local_768,QP_KEY_TAG_TIME,
                 fVar38 / 1000.0);
      tcu::TestLog::writeFloat
                (local_728,(char *)local_618._0_8_,local_5f8._M_dataplus._M_p,
                 (char *)local_5d8._0_8_,local_5b8._M_allocated_capacity._0_4_,
                 (float)local_5b8._M_allocated_capacity._4_4_);
      local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_720,local_680._0_8_,(pointer)(local_680._0_8_ + local_680._8_8_));
      std::__cxx11::string::append((char *)&local_720);
      plVar19 = (long *)std::__cxx11::string::append((char *)&local_720);
      local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_7a8.field_2._M_allocated_capacity = *psVar22;
        local_7a8.field_2._8_4_ = (undefined4)plVar19[3];
        local_7a8.field_2._12_4_ = *(undefined4 *)((long)plVar19 + 0x1c);
      }
      else {
        local_7a8.field_2._M_allocated_capacity = *psVar22;
        local_7a8._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_7a8._M_string_length = plVar19[1];
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_6d8 = &local_6c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_6d8," of specialization time","");
      plVar19 = (long *)std::__cxx11::string::replace((ulong)&local_6d8,0,(char *)0x0,0x675253);
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_6f8.field_2._M_allocated_capacity = *psVar22;
        local_6f8.field_2._8_8_ = plVar19[3];
        local_6f8._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_6f8.field_2._M_allocated_capacity = *psVar22;
        local_6f8._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_6f8._M_string_length = plVar19[1];
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b8,"ms","");
      fVar38 = vectorFloatMaximumMinusMinimum<long>(&local_478);
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_458,&local_7a8,&local_6f8,&local_6b8,QP_KEY_TAG_TIME,
                 fVar38 / 1000.0);
      tcu::TestLog::writeFloat
                (local_728,_local_458,(char *)local_448._16_8_,(char *)local_428._16_8_,
                 local_408._16_4_,(float)local_408._20_4_);
      if ((undefined1 *)local_428._16_8_ != local_408) {
        operator_delete((void *)local_428._16_8_,local_408._0_8_ + 1);
      }
      if ((undefined1 *)local_448._16_8_ != local_428) {
        operator_delete((void *)local_448._16_8_,local_428._0_8_ + 1);
      }
      if (_local_458 != local_448) {
        operator_delete(_local_458,local_448._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
        operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f8._M_dataplus._M_p != paVar2) {
        operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
      }
      if (local_6d8 != &local_6c8) {
        operator_delete(local_6d8,local_6c8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
        operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_720._M_dataplus._M_p != &local_720.field_2) {
        operator_delete(local_720._M_dataplus._M_p,local_720.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_5d8._0_8_ != (pointer)local_5c8) {
        operator_delete((void *)local_5d8._0_8_,(ulong)(local_5c8._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
        operator_delete(local_5f8._M_dataplus._M_p,
                        CONCAT71(local_5f8.field_2._M_allocated_capacity._1_7_,
                                 local_5f8.field_2._M_local_buf[0]) + 1);
      }
      if ((TestLog *)local_618._0_8_ != (TestLog *)(local_618 + 0x10)) {
        operator_delete((void *)local_618._0_8_,(ulong)(local_608._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_768._M_dataplus._M_p != &local_768.field_2) {
        operator_delete(local_768._M_dataplus._M_p,local_768.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
        operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_788._M_dataplus._M_p != &local_788.field_2) {
        operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_748._M_dataplus._M_p != &local_748.field_2) {
        operator_delete(local_748._M_dataplus._M_p,local_748.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7e8._M_dataplus._M_p != &local_7e8.field_2) {
        operator_delete(local_7e8._M_dataplus._M_p,local_7e8.field_2._M_allocated_capacity + 1);
      }
      local_7e8._M_dataplus._M_p = (pointer)&local_7e8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_7e8,local_680._0_8_,(pointer)(local_680._0_8_ + local_680._8_8_));
      std::__cxx11::string::append((char *)&local_7e8);
      plVar19 = (long *)std::__cxx11::string::append((char *)&local_7e8);
      local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_748.field_2._M_allocated_capacity = *psVar22;
        local_748.field_2._8_8_ = plVar19[3];
      }
      else {
        local_748.field_2._M_allocated_capacity = *psVar22;
        local_748._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_748._M_string_length._0_4_ = (deUint32)plVar19[1];
      local_748._M_string_length._4_4_ = (undefined4)((ulong)plVar19[1] >> 0x20);
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_788," of compilation time","");
      plVar19 = (long *)std::__cxx11::string::replace((ulong)&local_788,0,(char *)0x0,0x67526f);
      local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_7c8.field_2._M_allocated_capacity = *psVar22;
        local_7c8.field_2._8_4_ = (undefined4)plVar19[3];
        local_7c8.field_2._12_4_ = *(undefined4 *)((long)plVar19 + 0x1c);
      }
      else {
        local_7c8.field_2._M_allocated_capacity = *psVar22;
        local_7c8._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_7c8._M_string_length = plVar19[1];
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"");
      fVar38 = vectorFloatRelativeMaximumMinusMinimum<long>
                         ((vector<long,_std::allocator<long>_> *)&local_498);
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_618,&local_748,&local_7c8,&local_768,QP_KEY_TAG_NONE,
                 fVar38);
      tcu::TestLog::writeFloat
                (local_728,(char *)local_618._0_8_,local_5f8._M_dataplus._M_p,
                 (char *)local_5d8._0_8_,local_5b8._M_allocated_capacity._0_4_,
                 (float)local_5b8._M_allocated_capacity._4_4_);
      local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_720,local_680._0_8_,(pointer)(local_680._0_8_ + local_680._8_8_));
      std::__cxx11::string::append((char *)&local_720);
      plVar19 = (long *)std::__cxx11::string::append((char *)&local_720);
      local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_7a8.field_2._M_allocated_capacity = *psVar22;
        local_7a8.field_2._8_4_ = (undefined4)plVar19[3];
        local_7a8.field_2._12_4_ = *(undefined4 *)((long)plVar19 + 0x1c);
      }
      else {
        local_7a8.field_2._M_allocated_capacity = *psVar22;
        local_7a8._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_7a8._M_string_length = plVar19[1];
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_6d8 = &local_6c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_6d8," of specialization time","");
      plVar19 = (long *)std::__cxx11::string::replace((ulong)&local_6d8,0,(char *)0x0,0x67526f);
      psVar22 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_6f8.field_2._M_allocated_capacity = *psVar22;
        local_6f8.field_2._8_8_ = plVar19[3];
        local_6f8._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_6f8.field_2._M_allocated_capacity = *psVar22;
        local_6f8._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_6f8._M_string_length = plVar19[1];
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b8,"");
      fVar38 = vectorFloatRelativeMaximumMinusMinimum<long>(&local_478);
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_458,&local_7a8,&local_6f8,&local_6b8,QP_KEY_TAG_NONE,
                 fVar38);
      tcu::TestLog::writeFloat
                (local_728,_local_458,(char *)local_448._16_8_,(char *)local_428._16_8_,
                 local_408._16_4_,(float)local_408._20_4_);
      if ((undefined1 *)local_428._16_8_ != local_408) {
        operator_delete((void *)local_428._16_8_,local_408._0_8_ + 1);
      }
      if ((undefined1 *)local_448._16_8_ != local_428) {
        operator_delete((void *)local_448._16_8_,local_428._0_8_ + 1);
      }
      if (_local_458 != local_448) {
        operator_delete(_local_458,local_448._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
        operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f8._M_dataplus._M_p != paVar2) {
        operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
      }
      if (local_6d8 != &local_6c8) {
        operator_delete(local_6d8,local_6c8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
        operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_720._M_dataplus._M_p != &local_720.field_2) {
        operator_delete(local_720._M_dataplus._M_p,local_720.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_5d8._0_8_ != (pointer)local_5c8) {
        operator_delete((void *)local_5d8._0_8_,(ulong)(local_5c8._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
        operator_delete(local_5f8._M_dataplus._M_p,
                        CONCAT71(local_5f8.field_2._M_allocated_capacity._1_7_,
                                 local_5f8.field_2._M_local_buf[0]) + 1);
      }
      if ((TestLog *)local_618._0_8_ != (TestLog *)(local_618 + 0x10)) {
        operator_delete((void *)local_618._0_8_,(ulong)(local_608._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_768._M_dataplus._M_p != &local_768.field_2) {
        operator_delete(local_768._M_dataplus._M_p,local_768.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
        operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_788._M_dataplus._M_p != &local_788.field_2) {
        operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_748._M_dataplus._M_p != &local_748.field_2) {
        operator_delete(local_748._M_dataplus._M_p,local_748.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7e8._M_dataplus._M_p != &local_7e8.field_2) {
        operator_delete(local_7e8._M_dataplus._M_p,local_7e8.field_2._M_allocated_capacity + 1);
      }
      if (iVar11 != 0) {
        fVar38 = vectorFloatMedianAbsoluteDeviation<long>
                           ((vector<long,_std::allocator<long>_> *)&local_498);
        local_698 = (code *)CONCAT44(local_698._4_4_,fVar38);
        fVar38 = vectorFloatMedian<long>((vector<long,_std::allocator<long>_> *)&local_498);
        if (((fVar38 != 0.0) || (NAN(fVar38))) && (0.05 < (float)local_698 / fVar38)) {
          local_618._0_8_ = local_728;
          poVar1 = (ostringstream *)(local_618 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,
                     "\nWARNING: couldn\'t achieve relative median absolute deviation under threshold value "
                     ,0x54);
          std::ostream::_M_insert<double>(0.05000000074505806);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1," for compilation time of the lowest 50% of measurements",
                     0x37);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_618,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_5a0);
        }
      }
      if ((pointer *)
          local_478.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer *)0x0) {
        operator_delete(local_478.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_478.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_478.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_498._M_dataplus._M_p,
                        local_498.field_2._M_allocated_capacity - (long)local_498._M_dataplus._M_p);
      }
      if ((undefined1 *)local_680._0_8_ != local_680 + 0x10) {
        operator_delete((void *)local_680._0_8_,local_670._M_allocated_capacity + 1);
      }
      bVar10 = iVar11 == 0;
      iVar11 = iVar11 + 1;
    } while (bVar10);
    tcu::TestLog::endSection(local_728);
    uVar20 = 0;
    do {
      iVar11 = (int)uVar20;
      pcVar33 = "Average";
      if (iVar11 == 0) {
        pcVar33 = "Median";
      }
      _local_458 = local_448;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_458,pcVar33,pcVar33 + ((ulong)(iVar11 == 0) ^ 7));
      local_680._0_8_ = local_680 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_680,_local_458,local_450._M_p + _local_458);
      std::__cxx11::string::append((char *)local_680);
      local_698 = vectorFloatAverage<long>;
      if (iVar11 == 0) {
        local_698 = vectorFloatMedian<long>;
      }
      local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_748,local_680._0_8_,(pointer)(local_680._0_8_ + local_680._8_8_));
      std::__cxx11::string::append((char *)&local_748);
      local_7e8._M_dataplus._M_p = (pointer)&local_7e8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_7e8,local_680._0_8_,(pointer)(local_680._0_8_ + local_680._8_8_));
      std::__cxx11::string::append((char *)&local_7e8);
      tcu::LogSection::LogSection((LogSection *)local_618,&local_748,&local_7e8);
      tcu::TestLog::startSection(local_728,(char *)local_618._0_8_,local_5f8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
        operator_delete(local_5f8._M_dataplus._M_p,
                        CONCAT71(local_5f8.field_2._M_allocated_capacity._1_7_,
                                 local_5f8.field_2._M_local_buf[0]) + 1);
      }
      if ((TestLog *)local_618._0_8_ != (TestLog *)(local_618 + 0x10)) {
        operator_delete((void *)local_618._0_8_,(ulong)(local_608._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7e8._M_dataplus._M_p != &local_7e8.field_2) {
        operator_delete(local_7e8._M_dataplus._M_p,local_7e8.field_2._M_allocated_capacity + 1);
      }
      local_58 = uVar20;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_748._M_dataplus._M_p != &local_748.field_2) {
        operator_delete(local_748._M_dataplus._M_p,local_748.field_2._M_allocated_capacity + 1);
      }
      iVar11 = 1;
      do {
        pcVar33 = "LowestHalf";
        if (iVar11 == 1) {
          pcVar33 = "";
        }
        local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
        pcVar30 = pcVar33 + 10;
        if (iVar11 == 1) {
          pcVar30 = pcVar33;
        }
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_748,pcVar33,pcVar30);
        local_688 = CONCAT71(local_688._1_7_,iVar11 == 1);
        local_618._0_8_ = local_728;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_618 + 8));
        local_280 = CONCAT44(local_280._4_4_,iVar11);
        pcVar33 = "\nFor only the lowest 50% of the measurements:";
        if (iVar11 == 1) {
          pcVar33 = "For all measurements:";
        }
        lVar37 = 0x2d;
        if (iVar11 == 1) {
          lVar37 = 0x15;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_618 + 8),pcVar33,lVar37);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_618,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_618 + 8));
        std::ios_base::~ios_base(local_5a0);
        local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_7c8,local_748._M_dataplus._M_p,
                   local_748._M_dataplus._M_p +
                   CONCAT44(local_748._M_string_length._4_4_,(deUint32)local_748._M_string_length));
        std::__cxx11::string::append((char *)&local_7c8);
        plVar19 = (long *)std::__cxx11::string::_M_append((char *)&local_7c8,(ulong)_local_458);
        local_7e8._M_dataplus._M_p = (pointer)&local_7e8.field_2;
        psVar22 = (size_type *)(plVar19 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar19 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar22) {
          local_7e8.field_2._M_allocated_capacity = *psVar22;
          local_7e8.field_2._8_8_ = plVar19[3];
        }
        else {
          local_7e8.field_2._M_allocated_capacity = *psVar22;
          local_7e8._M_dataplus._M_p = (pointer)*plVar19;
        }
        local_7e8._M_string_length = plVar19[1];
        *plVar19 = (long)psVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_768,_local_458,local_450._M_p + _local_458);
        std::__cxx11::string::append((char *)&local_768);
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_768);
        local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
        psVar22 = (size_type *)(plVar19 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar19 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar22) {
          local_788.field_2._M_allocated_capacity = *psVar22;
          local_788.field_2._8_4_ = (undefined4)plVar19[3];
          local_788.field_2._12_4_ = *(undefined4 *)((long)plVar19 + 0x1c);
        }
        else {
          local_788.field_2._M_allocated_capacity = *psVar22;
          local_788._M_dataplus._M_p = (pointer)*plVar19;
        }
        local_788._M_string_length = plVar19[1];
        *plVar19 = (long)psVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"ms","");
        uVar20 = local_688 & 0xff;
        local_688 = CONCAT44(local_688._4_4_,*(float *)(&DAT_00674c20 + uVar20 * 4));
        vectorLowestPercentage<long>
                  ((vector<long,_std::allocator<long>_> *)&local_720,&local_118,
                   *(float *)(&DAT_00674c20 + uVar20 * 4));
        fVar38 = (float)(*local_698)(&local_720);
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)local_618,&local_7e8,&local_788,&local_7a8,QP_KEY_TAG_TIME,
                   fVar38 / 1000.0);
        tcu::TestLog::writeFloat
                  (local_728,(char *)local_618._0_8_,local_5f8._M_dataplus._M_p,
                   (char *)local_5d8._0_8_,local_5b8._M_allocated_capacity._0_4_,
                   (float)local_5b8._M_allocated_capacity._4_4_);
        if ((pointer)local_5d8._0_8_ != (pointer)local_5c8) {
          operator_delete((void *)local_5d8._0_8_,(ulong)(local_5c8._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
          operator_delete(local_5f8._M_dataplus._M_p,
                          CONCAT71(local_5f8.field_2._M_allocated_capacity._1_7_,
                                   local_5f8.field_2._M_local_buf[0]) + 1);
        }
        if ((TestLog *)local_618._0_8_ != (TestLog *)(local_618 + 0x10)) {
          operator_delete((void *)local_618._0_8_,(ulong)(local_608._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_720._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_720._M_dataplus._M_p,
                          local_720.field_2._M_allocated_capacity - (long)local_720._M_dataplus._M_p
                         );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
          operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_788._M_dataplus._M_p != &local_788.field_2) {
          operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_768._M_dataplus._M_p != &local_768.field_2) {
          operator_delete(local_768._M_dataplus._M_p,local_768.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7e8._M_dataplus._M_p != &local_7e8.field_2) {
          operator_delete(local_7e8._M_dataplus._M_p,local_7e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
          operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
        }
        local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_7c8,local_748._M_dataplus._M_p,
                   local_748._M_dataplus._M_p +
                   CONCAT44(local_748._M_string_length._4_4_,(deUint32)local_748._M_string_length));
        std::__cxx11::string::append((char *)&local_7c8);
        plVar19 = (long *)std::__cxx11::string::_M_append((char *)&local_7c8,(ulong)_local_458);
        local_7e8._M_dataplus._M_p = (pointer)&local_7e8.field_2;
        psVar22 = (size_type *)(plVar19 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar19 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar22) {
          local_7e8.field_2._M_allocated_capacity = *psVar22;
          local_7e8.field_2._8_8_ = plVar19[3];
        }
        else {
          local_7e8.field_2._M_allocated_capacity = *psVar22;
          local_7e8._M_dataplus._M_p = (pointer)*plVar19;
        }
        local_7e8._M_string_length = plVar19[1];
        *plVar19 = (long)psVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_768,_local_458,local_450._M_p + _local_458);
        std::__cxx11::string::append((char *)&local_768);
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_768);
        local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
        psVar22 = (size_type *)(plVar19 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar19 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar22) {
          local_788.field_2._M_allocated_capacity = *psVar22;
          local_788.field_2._8_4_ = (undefined4)plVar19[3];
          local_788.field_2._12_4_ = *(undefined4 *)((long)plVar19 + 0x1c);
        }
        else {
          local_788.field_2._M_allocated_capacity = *psVar22;
          local_788._M_dataplus._M_p = (pointer)*plVar19;
        }
        local_788._M_string_length = plVar19[1];
        *plVar19 = (long)psVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"ms","");
        vectorLowestPercentage<long>
                  ((vector<long,_std::allocator<long>_> *)&local_720,&local_138,(float)local_688);
        fVar38 = (float)(*local_698)(&local_720);
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)local_618,&local_7e8,&local_788,&local_7a8,QP_KEY_TAG_TIME,
                   fVar38 / 1000.0);
        tcu::TestLog::writeFloat
                  (local_728,(char *)local_618._0_8_,local_5f8._M_dataplus._M_p,
                   (char *)local_5d8._0_8_,local_5b8._M_allocated_capacity._0_4_,
                   (float)local_5b8._M_allocated_capacity._4_4_);
        if ((pointer)local_5d8._0_8_ != (pointer)local_5c8) {
          operator_delete((void *)local_5d8._0_8_,(ulong)(local_5c8._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
          operator_delete(local_5f8._M_dataplus._M_p,
                          CONCAT71(local_5f8.field_2._M_allocated_capacity._1_7_,
                                   local_5f8.field_2._M_local_buf[0]) + 1);
        }
        if ((TestLog *)local_618._0_8_ != (TestLog *)(local_618 + 0x10)) {
          operator_delete((void *)local_618._0_8_,(ulong)(local_608._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_720._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_720._M_dataplus._M_p,
                          local_720.field_2._M_allocated_capacity - (long)local_720._M_dataplus._M_p
                         );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
          operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_788._M_dataplus._M_p != &local_788.field_2) {
          operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_768._M_dataplus._M_p != &local_768.field_2) {
          operator_delete(local_768._M_dataplus._M_p,local_768.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7e8._M_dataplus._M_p != &local_7e8.field_2) {
          operator_delete(local_7e8._M_dataplus._M_p,local_7e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
          operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
        }
        local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_7c8,local_748._M_dataplus._M_p,
                   local_748._M_dataplus._M_p +
                   CONCAT44(local_748._M_string_length._4_4_,(deUint32)local_748._M_string_length));
        std::__cxx11::string::append((char *)&local_7c8);
        plVar19 = (long *)std::__cxx11::string::_M_append((char *)&local_7c8,(ulong)_local_458);
        local_7e8._M_dataplus._M_p = (pointer)&local_7e8.field_2;
        psVar22 = (size_type *)(plVar19 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar19 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar22) {
          local_7e8.field_2._M_allocated_capacity = *psVar22;
          local_7e8.field_2._8_8_ = plVar19[3];
        }
        else {
          local_7e8.field_2._M_allocated_capacity = *psVar22;
          local_7e8._M_dataplus._M_p = (pointer)*plVar19;
        }
        local_7e8._M_string_length = plVar19[1];
        *plVar19 = (long)psVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_768,_local_458,local_450._M_p + _local_458);
        std::__cxx11::string::append((char *)&local_768);
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_768);
        local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
        psVar22 = (size_type *)(plVar19 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar19 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar22) {
          local_788.field_2._M_allocated_capacity = *psVar22;
          local_788.field_2._8_4_ = (undefined4)plVar19[3];
          local_788.field_2._12_4_ = *(undefined4 *)((long)plVar19 + 0x1c);
        }
        else {
          local_788.field_2._M_allocated_capacity = *psVar22;
          local_788._M_dataplus._M_p = (pointer)*plVar19;
        }
        local_788._M_string_length = plVar19[1];
        *plVar19 = (long)psVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"ms","");
        vectorLowestPercentage<long>
                  ((vector<long,_std::allocator<long>_> *)&local_720,&local_158,(float)local_688);
        fVar38 = (float)(*local_698)(&local_720);
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)local_618,&local_7e8,&local_788,&local_7a8,QP_KEY_TAG_TIME,
                   fVar38 / 1000.0);
        tcu::TestLog::writeFloat
                  (local_728,(char *)local_618._0_8_,local_5f8._M_dataplus._M_p,
                   (char *)local_5d8._0_8_,local_5b8._M_allocated_capacity._0_4_,
                   (float)local_5b8._M_allocated_capacity._4_4_);
        if ((pointer)local_5d8._0_8_ != (pointer)local_5c8) {
          operator_delete((void *)local_5d8._0_8_,(ulong)(local_5c8._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
          operator_delete(local_5f8._M_dataplus._M_p,
                          CONCAT71(local_5f8.field_2._M_allocated_capacity._1_7_,
                                   local_5f8.field_2._M_local_buf[0]) + 1);
        }
        if ((TestLog *)local_618._0_8_ != (TestLog *)(local_618 + 0x10)) {
          operator_delete((void *)local_618._0_8_,(ulong)(local_608._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_720._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_720._M_dataplus._M_p,
                          local_720.field_2._M_allocated_capacity - (long)local_720._M_dataplus._M_p
                         );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
          operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_788._M_dataplus._M_p != &local_788.field_2) {
          operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_768._M_dataplus._M_p != &local_768.field_2) {
          operator_delete(local_768._M_dataplus._M_p,local_768.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7e8._M_dataplus._M_p != &local_7e8.field_2) {
          operator_delete(local_7e8._M_dataplus._M_p,local_7e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
          operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
        }
        local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_7c8,local_748._M_dataplus._M_p,
                   local_748._M_dataplus._M_p +
                   CONCAT44(local_748._M_string_length._4_4_,(deUint32)local_748._M_string_length));
        std::__cxx11::string::append((char *)&local_7c8);
        plVar19 = (long *)std::__cxx11::string::_M_append((char *)&local_7c8,(ulong)_local_458);
        local_7e8._M_dataplus._M_p = (pointer)&local_7e8.field_2;
        psVar22 = (size_type *)(plVar19 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar19 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar22) {
          local_7e8.field_2._M_allocated_capacity = *psVar22;
          local_7e8.field_2._8_8_ = plVar19[3];
        }
        else {
          local_7e8.field_2._M_allocated_capacity = *psVar22;
          local_7e8._M_dataplus._M_p = (pointer)*plVar19;
        }
        local_7e8._M_string_length = plVar19[1];
        *plVar19 = (long)psVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_768,_local_458,local_450._M_p + _local_458);
        std::__cxx11::string::append((char *)&local_768);
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_768);
        local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
        psVar22 = (size_type *)(plVar19 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar19 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar22) {
          local_788.field_2._M_allocated_capacity = *psVar22;
          local_788.field_2._8_4_ = (undefined4)plVar19[3];
          local_788.field_2._12_4_ = *(undefined4 *)((long)plVar19 + 0x1c);
        }
        else {
          local_788.field_2._M_allocated_capacity = *psVar22;
          local_788._M_dataplus._M_p = (pointer)*plVar19;
        }
        local_788._M_string_length = plVar19[1];
        *plVar19 = (long)psVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"ms","");
        vectorLowestPercentage<long>
                  ((vector<long,_std::allocator<long>_> *)&local_720,&local_178,(float)local_688);
        fVar38 = (float)(*local_698)(&local_720);
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)local_618,&local_7e8,&local_788,&local_7a8,QP_KEY_TAG_TIME,
                   fVar38 / 1000.0);
        tcu::TestLog::writeFloat
                  (local_728,(char *)local_618._0_8_,local_5f8._M_dataplus._M_p,
                   (char *)local_5d8._0_8_,local_5b8._M_allocated_capacity._0_4_,
                   (float)local_5b8._M_allocated_capacity._4_4_);
        if ((pointer)local_5d8._0_8_ != (pointer)local_5c8) {
          operator_delete((void *)local_5d8._0_8_,(ulong)(local_5c8._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
          operator_delete(local_5f8._M_dataplus._M_p,
                          CONCAT71(local_5f8.field_2._M_allocated_capacity._1_7_,
                                   local_5f8.field_2._M_local_buf[0]) + 1);
        }
        if ((TestLog *)local_618._0_8_ != (TestLog *)(local_618 + 0x10)) {
          operator_delete((void *)local_618._0_8_,(ulong)(local_608._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_720._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_720._M_dataplus._M_p,
                          local_720.field_2._M_allocated_capacity - (long)local_720._M_dataplus._M_p
                         );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
          operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_788._M_dataplus._M_p != &local_788.field_2) {
          operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_768._M_dataplus._M_p != &local_768.field_2) {
          operator_delete(local_768._M_dataplus._M_p,local_768.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7e8._M_dataplus._M_p != &local_7e8.field_2) {
          operator_delete(local_7e8._M_dataplus._M_p,local_7e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
          operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
        }
        local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_7c8,local_748._M_dataplus._M_p,
                   local_748._M_dataplus._M_p +
                   CONCAT44(local_748._M_string_length._4_4_,(deUint32)local_748._M_string_length));
        std::__cxx11::string::append((char *)&local_7c8);
        plVar19 = (long *)std::__cxx11::string::_M_append((char *)&local_7c8,(ulong)_local_458);
        local_7e8._M_dataplus._M_p = (pointer)&local_7e8.field_2;
        psVar22 = (size_type *)(plVar19 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar19 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar22) {
          local_7e8.field_2._M_allocated_capacity = *psVar22;
          local_7e8.field_2._8_8_ = plVar19[3];
        }
        else {
          local_7e8.field_2._M_allocated_capacity = *psVar22;
          local_7e8._M_dataplus._M_p = (pointer)*plVar19;
        }
        local_7e8._M_string_length = plVar19[1];
        *plVar19 = (long)psVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_768,_local_458,local_450._M_p + _local_458);
        std::__cxx11::string::append((char *)&local_768);
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_768);
        local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
        psVar22 = (size_type *)(plVar19 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar19 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar22) {
          local_788.field_2._M_allocated_capacity = *psVar22;
          local_788.field_2._8_4_ = (undefined4)plVar19[3];
          local_788.field_2._12_4_ = *(undefined4 *)((long)plVar19 + 0x1c);
        }
        else {
          local_788.field_2._M_allocated_capacity = *psVar22;
          local_788._M_dataplus._M_p = (pointer)*plVar19;
        }
        local_788._M_string_length = plVar19[1];
        *plVar19 = (long)psVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"ms","");
        vectorLowestPercentage<long>
                  ((vector<long,_std::allocator<long>_> *)&local_720,&local_198,(float)local_688);
        fVar38 = (float)(*local_698)(&local_720);
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)local_618,&local_7e8,&local_788,&local_7a8,QP_KEY_TAG_TIME,
                   fVar38 / 1000.0);
        tcu::TestLog::writeFloat
                  (local_728,(char *)local_618._0_8_,local_5f8._M_dataplus._M_p,
                   (char *)local_5d8._0_8_,local_5b8._M_allocated_capacity._0_4_,
                   (float)local_5b8._M_allocated_capacity._4_4_);
        if ((pointer)local_5d8._0_8_ != (pointer)local_5c8) {
          operator_delete((void *)local_5d8._0_8_,(ulong)(local_5c8._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
          operator_delete(local_5f8._M_dataplus._M_p,
                          CONCAT71(local_5f8.field_2._M_allocated_capacity._1_7_,
                                   local_5f8.field_2._M_local_buf[0]) + 1);
        }
        if ((TestLog *)local_618._0_8_ != (TestLog *)(local_618 + 0x10)) {
          operator_delete((void *)local_618._0_8_,(ulong)(local_608._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_720._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_720._M_dataplus._M_p,
                          local_720.field_2._M_allocated_capacity - (long)local_720._M_dataplus._M_p
                         );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
          operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_788._M_dataplus._M_p != &local_788.field_2) {
          operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_768._M_dataplus._M_p != &local_768.field_2) {
          operator_delete(local_768._M_dataplus._M_p,local_768.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7e8._M_dataplus._M_p != &local_7e8.field_2) {
          operator_delete(local_7e8._M_dataplus._M_p,local_7e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
          operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
        }
        local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_7c8,local_748._M_dataplus._M_p,
                   local_748._M_dataplus._M_p +
                   CONCAT44(local_748._M_string_length._4_4_,(deUint32)local_748._M_string_length));
        std::__cxx11::string::append((char *)&local_7c8);
        plVar19 = (long *)std::__cxx11::string::_M_append((char *)&local_7c8,(ulong)_local_458);
        local_7e8._M_dataplus._M_p = (pointer)&local_7e8.field_2;
        psVar22 = (size_type *)(plVar19 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar19 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar22) {
          local_7e8.field_2._M_allocated_capacity = *psVar22;
          local_7e8.field_2._8_8_ = plVar19[3];
        }
        else {
          local_7e8.field_2._M_allocated_capacity = *psVar22;
          local_7e8._M_dataplus._M_p = (pointer)*plVar19;
        }
        local_7e8._M_string_length = plVar19[1];
        *plVar19 = (long)psVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_768,_local_458,local_450._M_p + _local_458);
        std::__cxx11::string::append((char *)&local_768);
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_768);
        local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
        psVar22 = (size_type *)(plVar19 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar19 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar22) {
          local_788.field_2._M_allocated_capacity = *psVar22;
          local_788.field_2._8_4_ = (undefined4)plVar19[3];
          local_788.field_2._12_4_ = *(undefined4 *)((long)plVar19 + 0x1c);
        }
        else {
          local_788.field_2._M_allocated_capacity = *psVar22;
          local_788._M_dataplus._M_p = (pointer)*plVar19;
        }
        local_788._M_string_length = plVar19[1];
        *plVar19 = (long)psVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"ms","");
        vectorLowestPercentage<long>
                  ((vector<long,_std::allocator<long>_> *)&local_720,&local_1b8,(float)local_688);
        fVar38 = (float)(*local_698)(&local_720);
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)local_618,&local_7e8,&local_788,&local_7a8,QP_KEY_TAG_TIME,
                   fVar38 / 1000.0);
        tcu::TestLog::writeFloat
                  (local_728,(char *)local_618._0_8_,local_5f8._M_dataplus._M_p,
                   (char *)local_5d8._0_8_,local_5b8._M_allocated_capacity._0_4_,
                   (float)local_5b8._M_allocated_capacity._4_4_);
        if ((pointer)local_5d8._0_8_ != (pointer)local_5c8) {
          operator_delete((void *)local_5d8._0_8_,(ulong)(local_5c8._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
          operator_delete(local_5f8._M_dataplus._M_p,
                          CONCAT71(local_5f8.field_2._M_allocated_capacity._1_7_,
                                   local_5f8.field_2._M_local_buf[0]) + 1);
        }
        if ((TestLog *)local_618._0_8_ != (TestLog *)(local_618 + 0x10)) {
          operator_delete((void *)local_618._0_8_,(ulong)(local_608._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_720._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_720._M_dataplus._M_p,
                          local_720.field_2._M_allocated_capacity - (long)local_720._M_dataplus._M_p
                         );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
          operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_788._M_dataplus._M_p != &local_788.field_2) {
          operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_768._M_dataplus._M_p != &local_768.field_2) {
          operator_delete(local_768._M_dataplus._M_p,local_768.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7e8._M_dataplus._M_p != &local_7e8.field_2) {
          operator_delete(local_7e8._M_dataplus._M_p,local_7e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
          operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
        }
        local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_7c8,local_748._M_dataplus._M_p,
                   local_748._M_dataplus._M_p +
                   CONCAT44(local_748._M_string_length._4_4_,(deUint32)local_748._M_string_length));
        std::__cxx11::string::append((char *)&local_7c8);
        plVar19 = (long *)std::__cxx11::string::_M_append((char *)&local_7c8,(ulong)_local_458);
        local_7e8._M_dataplus._M_p = (pointer)&local_7e8.field_2;
        psVar22 = (size_type *)(plVar19 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar19 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar22) {
          local_7e8.field_2._M_allocated_capacity = *psVar22;
          local_7e8.field_2._8_8_ = plVar19[3];
        }
        else {
          local_7e8.field_2._M_allocated_capacity = *psVar22;
          local_7e8._M_dataplus._M_p = (pointer)*plVar19;
        }
        local_7e8._M_string_length = plVar19[1];
        *plVar19 = (long)psVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_768,_local_458,local_450._M_p + _local_458);
        std::__cxx11::string::append((char *)&local_768);
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_768);
        local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
        psVar22 = (size_type *)(plVar19 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar19 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar22) {
          local_788.field_2._M_allocated_capacity = *psVar22;
          local_788.field_2._8_4_ = (undefined4)plVar19[3];
          local_788.field_2._12_4_ = *(undefined4 *)((long)plVar19 + 0x1c);
        }
        else {
          local_788.field_2._M_allocated_capacity = *psVar22;
          local_788._M_dataplus._M_p = (pointer)*plVar19;
        }
        local_788._M_string_length = plVar19[1];
        *plVar19 = (long)psVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"ms","");
        vectorLowestPercentage<long>
                  ((vector<long,_std::allocator<long>_> *)&local_720,&local_1d8,(float)local_688);
        fVar38 = (float)(*local_698)(&local_720);
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)local_618,&local_7e8,&local_788,&local_7a8,QP_KEY_TAG_TIME,
                   fVar38 / 1000.0);
        tcu::TestLog::writeFloat
                  (local_728,(char *)local_618._0_8_,local_5f8._M_dataplus._M_p,
                   (char *)local_5d8._0_8_,local_5b8._M_allocated_capacity._0_4_,
                   (float)local_5b8._M_allocated_capacity._4_4_);
        if ((pointer)local_5d8._0_8_ != (pointer)local_5c8) {
          operator_delete((void *)local_5d8._0_8_,(ulong)(local_5c8._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
          operator_delete(local_5f8._M_dataplus._M_p,
                          CONCAT71(local_5f8.field_2._M_allocated_capacity._1_7_,
                                   local_5f8.field_2._M_local_buf[0]) + 1);
        }
        if ((TestLog *)local_618._0_8_ != (TestLog *)(local_618 + 0x10)) {
          operator_delete((void *)local_618._0_8_,(ulong)(local_608._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_720._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_720._M_dataplus._M_p,
                          local_720.field_2._M_allocated_capacity - (long)local_720._M_dataplus._M_p
                         );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
          operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_788._M_dataplus._M_p != &local_788.field_2) {
          operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_768._M_dataplus._M_p != &local_768.field_2) {
          operator_delete(local_768._M_dataplus._M_p,local_768.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7e8._M_dataplus._M_p != &local_7e8.field_2) {
          operator_delete(local_7e8._M_dataplus._M_p,local_7e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
          operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
        }
        local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_7c8,local_748._M_dataplus._M_p,
                   local_748._M_dataplus._M_p +
                   CONCAT44(local_748._M_string_length._4_4_,(deUint32)local_748._M_string_length));
        std::__cxx11::string::append((char *)&local_7c8);
        plVar19 = (long *)std::__cxx11::string::_M_append((char *)&local_7c8,(ulong)_local_458);
        local_7e8._M_dataplus._M_p = (pointer)&local_7e8.field_2;
        psVar22 = (size_type *)(plVar19 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar19 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar22) {
          local_7e8.field_2._M_allocated_capacity = *psVar22;
          local_7e8.field_2._8_8_ = plVar19[3];
        }
        else {
          local_7e8.field_2._M_allocated_capacity = *psVar22;
          local_7e8._M_dataplus._M_p = (pointer)*plVar19;
        }
        local_7e8._M_string_length = plVar19[1];
        *plVar19 = (long)psVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_768,_local_458,local_450._M_p + _local_458);
        std::__cxx11::string::append((char *)&local_768);
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_768);
        local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
        psVar22 = (size_type *)(plVar19 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar19 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar22) {
          local_788.field_2._M_allocated_capacity = *psVar22;
          local_788.field_2._8_4_ = (undefined4)plVar19[3];
          local_788.field_2._12_4_ = *(undefined4 *)((long)plVar19 + 0x1c);
        }
        else {
          local_788.field_2._M_allocated_capacity = *psVar22;
          local_788._M_dataplus._M_p = (pointer)*plVar19;
        }
        local_788._M_string_length = plVar19[1];
        *plVar19 = (long)psVar22;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"ms","");
        vectorLowestPercentage<long>
                  ((vector<long,_std::allocator<long>_> *)&local_720,&local_1f8,(float)local_688);
        fVar38 = (float)(*local_698)(&local_720);
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)local_618,&local_7e8,&local_788,&local_7a8,QP_KEY_TAG_TIME,
                   fVar38 / 1000.0);
        tcu::TestLog::writeFloat
                  (local_728,(char *)local_618._0_8_,local_5f8._M_dataplus._M_p,
                   (char *)local_5d8._0_8_,local_5b8._M_allocated_capacity._0_4_,
                   (float)local_5b8._M_allocated_capacity._4_4_);
        if ((pointer)local_5d8._0_8_ != (pointer)local_5c8) {
          operator_delete((void *)local_5d8._0_8_,(ulong)(local_5c8._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
          operator_delete(local_5f8._M_dataplus._M_p,
                          CONCAT71(local_5f8.field_2._M_allocated_capacity._1_7_,
                                   local_5f8.field_2._M_local_buf[0]) + 1);
        }
        if ((TestLog *)local_618._0_8_ != (TestLog *)(local_618 + 0x10)) {
          operator_delete((void *)local_618._0_8_,(ulong)(local_608._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_720._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_720._M_dataplus._M_p,
                          local_720.field_2._M_allocated_capacity - (long)local_720._M_dataplus._M_p
                         );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
          operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_788._M_dataplus._M_p != &local_788.field_2) {
          operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_768._M_dataplus._M_p != &local_768.field_2) {
          operator_delete(local_768._M_dataplus._M_p,local_768.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7e8._M_dataplus._M_p != &local_7e8.field_2) {
          operator_delete(local_7e8._M_dataplus._M_p,local_7e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
          operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_748._M_dataplus._M_p != &local_748.field_2) {
          operator_delete(local_748._M_dataplus._M_p,local_748.field_2._M_allocated_capacity + 1);
        }
        iVar11 = (int)local_280 + -1;
      } while (iVar11 == 0);
      tcu::TestLog::endSection(local_728);
      uVar34 = local_58;
      pSVar36 = local_700;
      if ((undefined1 *)local_680._0_8_ != local_680 + 0x10) {
        operator_delete((void *)local_680._0_8_,local_670._M_allocated_capacity + 1);
      }
      if (_local_458 != local_448) {
        operator_delete(_local_458,local_448._0_8_ + 1);
      }
      uVar20 = (ulong)((int)uVar34 + 1);
    } while ((int)uVar34 == 0);
    poVar1 = (ostringstream *)(local_618 + 8);
    local_618._0_8_ = local_728;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Note: test result is the first quartile (i.e. median of the lowest half of measurements) of compilation times"
               ,0x6d);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_618,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_5a0);
    fVar38 = vectorFloatFirstQuartile<long>(&local_2b8);
    this_00 = (pSVar36->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    de::floatToString_abi_cxx11_((string *)local_618,(de *)0x2,fVar38 / 1000.0,precision);
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,(char *)local_618._0_8_);
    if ((TestLog *)local_618._0_8_ != (TestLog *)(local_618 + 0x10)) {
      operator_delete((void *)local_618._0_8_,(ulong)(local_608._M_allocated_capacity + 1));
    }
    if ((pSVar36->m_avoidCache != false) || (pSVar36->m_addWhitespaceAndComments == true)) {
      _local_458 = local_448;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_458,
                 "Note: the following shaders are the ones from the last iteration; ","");
      if (pSVar36->m_avoidCache == true) {
        std::__cxx11::string::append(local_458);
      }
      if (pSVar36->m_addWhitespaceAndComments == true) {
        pcVar33 = "";
        if (pSVar36->m_avoidCache != false) {
          pcVar33 = " as well as ";
        }
        local_680._0_8_ = local_680 + 0x10;
        pcVar30 = pcVar33 + 0xc;
        if (pSVar36->m_avoidCache == false) {
          pcVar30 = pcVar33;
        }
        std::__cxx11::string::_M_construct<char_const*>((string *)local_680,pcVar33,pcVar30);
        plVar19 = (long *)std::__cxx11::string::append(local_680);
        local_618._0_8_ = local_618 + 0x10;
        pTVar35 = (TestLog *)(plVar19 + 2);
        if ((TestLog *)*plVar19 == pTVar35) {
          local_608._M_allocated_capacity = (size_type)pTVar35->m_log;
          local_608._8_8_ = plVar19[3];
        }
        else {
          local_608._M_allocated_capacity = (size_type)pTVar35->m_log;
          local_618._0_8_ = (TestLog *)*plVar19;
        }
        local_618._8_8_ = plVar19[1];
        *plVar19 = (long)pTVar35;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        std::__cxx11::string::_M_append(local_458,local_618._0_8_);
        if ((TestLog *)local_618._0_8_ != (TestLog *)(local_618 + 0x10)) {
          operator_delete((void *)local_618._0_8_,(ulong)(local_608._M_allocated_capacity + 1));
        }
        if ((undefined1 *)local_680._0_8_ != local_680 + 0x10) {
          operator_delete((void *)local_680._0_8_,local_670._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::string::append(local_458);
      local_618._0_8_ = local_728;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      _Var28._M_p = _local_458;
      if (_local_458 == (char *)0x0) {
        std::ios::clear((int)poVar1 + (int)*(undefined8 *)(local_618._8_8_ - 0x18));
      }
      else {
        sVar21 = strlen(_local_458);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,_Var28._M_p,sVar21);
      }
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_618,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_5a0);
      if (_local_458 != local_448) {
        operator_delete(_local_458,local_448._0_8_ + 1);
      }
    }
    logProgramData(pSVar36,(BuildInfo *)local_c0,(ProgramContext *)local_268);
    if (local_298.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_298.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_298.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_298.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_2b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_2b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_1d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_1b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_198.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_198.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_198.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_198.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_138.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_138.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_138.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_138.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((TestLog *)
        local_118.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (TestLog *)0x0) {
      puVar32 = (undefined1 *)
                ((long)local_118.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage -
                (long)local_118.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start);
      pTVar35 = (TestLog *)
                local_118.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start;
LAB_0043d7f4:
      operator_delete(pTVar35,(ulong)puVar32);
    }
LAB_0043d7f9:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_p != &local_68) {
      operator_delete(local_78._M_p,
                      CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_allocated_capacity != &local_88) {
      operator_delete((void *)local_98._M_allocated_capacity,
                      CONCAT71(local_88._M_allocated_capacity._1_7_,local_88._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Stack_b8._M_p != &local_a8) {
      operator_delete(_Stack_b8._M_p,
                      CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0]) + 1);
    }
    std::
    vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
    ::~vector(&vStack_210);
    std::
    vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
    ::~vector((vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
               *)local_228);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_p != &local_238) {
      operator_delete(local_248._M_p,
                      CONCAT71(local_238._M_allocated_capacity._1_7_,local_238._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
      operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
    }
    if (local_2d8.
        super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2d8.
                      super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_2d8.
                            super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2d8.
                            super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return STOP;
}

Assistant:

ShaderCompilerCase::IterateResult ShaderCompilerCase::iterate (void)
{
	// Before actual measurements, compile and draw with a dummy shader to avoid possible initial slowdowns in the actual test.
	{
		deUint32		specID = getSpecializationID(0);
		ProgramContext	progCtx;
		progCtx.vertShaderSource = specializeShaderSource(singleVaryingVertexTemplate(), specID, SHADER_VALIDITY_VALID);
		progCtx.fragShaderSource = specializeShaderSource(singleVaryingFragmentTemplate(), specID, SHADER_VALIDITY_VALID);
		progCtx.vertexAttributes = singleValueShaderAttributes(getNameSpecialization(specID));

		ShadersAndProgram shadersAndProgram = createShadersAndProgram();
		setShaderSources(shadersAndProgram.vertShader, shadersAndProgram.fragShader, progCtx);

		BuildInfo buildInfo;
		buildInfo.vertCompileSuccess	= compileShader(shadersAndProgram.vertShader);
		buildInfo.fragCompileSuccess	= compileShader(shadersAndProgram.fragShader);
		buildInfo.linkSuccess			= linkAndUseProgram(shadersAndProgram.program);
		if (!(buildInfo.vertCompileSuccess && buildInfo.fragCompileSuccess && buildInfo.linkSuccess))
		{
			buildInfo.logs = getLogs(shadersAndProgram);
			logProgramData(buildInfo, progCtx);
			cleanup(shadersAndProgram, progCtx, buildInfo.linkSuccess);
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compilation failed");
			return STOP;
		}
		setShaderInputs(shadersAndProgram.program, progCtx);
		draw();
		cleanup(shadersAndProgram, progCtx, buildInfo.linkSuccess);
	}

	vector<Measurement>		measurements;
	// \note These are logged after measurements are done.
	ProgramContext			latestProgramContext;
	BuildInfo				latestBuildInfo;

	if (WARMUP_CPU_AT_BEGINNING_OF_CASE)
		tcu::warmupCPU();

	// Actual test measurements.
	while (!goodEnoughMeasurements(measurements))
	{
		// Create shaders, compile & link, set shader inputs and draw. Time measurement is done at relevant points.
		// \note Setting inputs and drawing are done twice in order to find out the time for actual compiling.

		// \note Shader data (sources and inputs) are generated and GL shader and program objects are created before any time measurements.
		ProgramContext		progCtx				= generateShaderData((int)measurements.size());
		ShadersAndProgram	shadersAndProgram	= createShadersAndProgram();
		BuildInfo			buildInfo;

		if (m_addWhitespaceAndComments)
		{
			const deUint32 hash = m_startHash ^ (deUint32)deInt32Hash((deInt32)measurements.size());
			progCtx.vertShaderSource = strWithWhiteSpaceAndComments(progCtx.vertShaderSource, hash);
			progCtx.fragShaderSource = strWithWhiteSpaceAndComments(progCtx.fragShaderSource, hash);
		}

		if (WARMUP_CPU_BEFORE_EACH_MEASUREMENT)
			tcu::warmupCPU();

		// \note Do NOT do anything too hefty between the first and last deGetMicroseconds() here (other than the gl calls); it would disturb the measurement.

		deUint64 startTime = deGetMicroseconds();

		setShaderSources(shadersAndProgram.vertShader, shadersAndProgram.fragShader, progCtx);
		deUint64 shaderSourceSetEndTime = deGetMicroseconds();

		buildInfo.vertCompileSuccess = compileShader(shadersAndProgram.vertShader);
		deUint64 vertexShaderCompileEndTime = deGetMicroseconds();

		buildInfo.fragCompileSuccess = compileShader(shadersAndProgram.fragShader);
		deUint64 fragmentShaderCompileEndTime = deGetMicroseconds();

		buildInfo.linkSuccess = linkAndUseProgram(shadersAndProgram.program);
		deUint64 programLinkEndTime = deGetMicroseconds();

		// Check compilation and linking status here, after all compilation and linking gl calls are made.
		if (!(buildInfo.vertCompileSuccess && buildInfo.fragCompileSuccess && buildInfo.linkSuccess))
		{
			buildInfo.logs = getLogs(shadersAndProgram);
			logProgramData(buildInfo, progCtx);
			cleanup(shadersAndProgram, progCtx, buildInfo.linkSuccess);
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compilation failed");
			return STOP;
		}

		setShaderInputs(shadersAndProgram.program, progCtx);
		deUint64 firstShaderInputSetEndTime = deGetMicroseconds();

		// Draw for the first time.
		draw();
		deUint64 firstDrawEndTime = deGetMicroseconds();

		// Set inputs and draw again.

		setShaderInputs(shadersAndProgram.program, progCtx);
		deUint64 secondShaderInputSetEndTime = deGetMicroseconds();

		draw();
		deUint64 secondDrawEndTime = deGetMicroseconds();

		// De-initializations (detach shaders etc.).

		buildInfo.logs = getLogs(shadersAndProgram);
		cleanup(shadersAndProgram, progCtx, buildInfo.linkSuccess);

		// Output measurement log later (after last measurement).

		measurements.push_back(Measurement((deInt64)(shaderSourceSetEndTime			- startTime),
										   (deInt64)(vertexShaderCompileEndTime		- shaderSourceSetEndTime),
										   (deInt64)(fragmentShaderCompileEndTime	- vertexShaderCompileEndTime),
										   (deInt64)(programLinkEndTime				- fragmentShaderCompileEndTime),
										   (deInt64)(firstShaderInputSetEndTime		- programLinkEndTime),
										   (deInt64)(firstDrawEndTime				- firstShaderInputSetEndTime),
										   (deInt64)(secondShaderInputSetEndTime	- firstDrawEndTime),
										   (deInt64)(secondDrawEndTime				- secondShaderInputSetEndTime)));

		latestBuildInfo			= buildInfo;
		latestProgramContext	= progCtx;

		m_testCtx.touchWatchdog(); // \note Measurements may take a while in a bad case.
	}

	// End of test case, log information about measurements.
	{
		TestLog& log = m_testCtx.getLog();

		vector<deInt64> sourceSetTimes;
		vector<deInt64> vertexCompileTimes;
		vector<deInt64> fragmentCompileTimes;
		vector<deInt64> programLinkTimes;
		vector<deInt64> firstInputSetTimes;
		vector<deInt64> firstDrawTimes;
		vector<deInt64> secondInputTimes;
		vector<deInt64> secondDrawTimes;
		vector<deInt64> firstPhaseTimes;
		vector<deInt64> secondPhaseTimes;
		vector<deInt64> totalTimesWithoutDraw;
		vector<deInt64> specializationTimes;

		if (!m_avoidCache)
			log << TestLog::Message << "Note: Testing cache hits, so the medians and averages exclude the first iteration." << TestLog::EndMessage;

		log << TestLog::Message << "Note: \"Specialization time\" means first draw time minus second draw time." << TestLog::EndMessage
			<< TestLog::Message << "Note: \"Compilation time\" means the time up to (and including) linking, plus specialization time." << TestLog::EndMessage;

		log << TestLog::Section("IterationMeasurements", "Iteration measurements of compilation and linking times");

		DE_ASSERT((int)measurements.size() > (m_avoidCache ? 0 : 1));

		for (int ndx = 0; ndx < (int)measurements.size(); ndx++)
		{
			const Measurement& curMeas = measurements[ndx];

			// Subtract time of second phase (second input setup and draw) from first (from start to end of first draw).
			// \note Cap if second phase seems unreasonably high (higher than first input set and draw).
			deInt64 timeWithoutDraw		= curMeas.totalTimeWithoutDraw();

			// Specialization time = first draw - second draw time. Again, cap at 0 if second draw was longer than first draw.
			deInt64 specializationTime	= de::max<deInt64>(0, curMeas.firstDrawTime - curMeas.secondDrawTime);

			if (ndx > 0 || m_avoidCache) // \note When allowing cache hits, don't account for the first measurement when calculating median or average.
			{
				sourceSetTimes.push_back		(curMeas.sourceSetTime);
				vertexCompileTimes.push_back	(curMeas.vertexCompileTime);
				fragmentCompileTimes.push_back	(curMeas.fragmentCompileTime);
				programLinkTimes.push_back		(curMeas.programLinkTime);
				firstInputSetTimes.push_back	(curMeas.firstInputSetTime);
				firstDrawTimes.push_back		(curMeas.firstDrawTime);
				firstPhaseTimes.push_back		(curMeas.firstPhase());
				secondDrawTimes.push_back		(curMeas.secondDrawTime);
				secondInputTimes.push_back		(curMeas.secondInputSetTime);
				secondPhaseTimes.push_back		(curMeas.secondPhase());
				totalTimesWithoutDraw.push_back	(timeWithoutDraw);
				specializationTimes.push_back	(specializationTime);
			}

			// Log this measurement.
			log << TestLog::Float("Measurement" + de::toString(ndx) + "CompilationTime",
								  "Measurement " + de::toString(ndx) + " compilation time",
								  "ms", QP_KEY_TAG_TIME, (float)timeWithoutDraw / 1000.0f)
				<< TestLog::Float("Measurement" + de::toString(ndx) + "SpecializationTime",
								  "Measurement " + de::toString(ndx) + " specialization time",
								  "ms", QP_KEY_TAG_TIME, (float)specializationTime / 1000.0f);
		}

		// Log some statistics.

		for (int entireRangeOrLowestHalf = 0; entireRangeOrLowestHalf < 2; entireRangeOrLowestHalf++)
		{
			bool				isEntireRange				= entireRangeOrLowestHalf == 0;
			string				statNamePrefix				= isEntireRange ? "" : "LowestHalf";
			vector<deInt64>		rangeTotalTimes				= isEntireRange ? totalTimesWithoutDraw	: vectorLowestPercentage(totalTimesWithoutDraw,	0.5f);
			vector<deInt64>		rangeSpecializationTimes	= isEntireRange ? specializationTimes	: vectorLowestPercentage(specializationTimes,	0.5f);

#define LOG_COMPILE_SPECIALIZE_TIME_STAT(NAME, DESC, FUNC)																													\
	log << TestLog::Float(statNamePrefix + "CompilationTime" + (NAME), (DESC) + string(" of compilation time"), "ms", QP_KEY_TAG_TIME, (FUNC)(rangeTotalTimes)/1000.0f)		\
		<< TestLog::Float(statNamePrefix + "SpecializationTime" + (NAME), (DESC) + string(" of specialization time"), "ms", QP_KEY_TAG_TIME, (FUNC)(rangeSpecializationTimes)/1000.0f)

#define LOG_COMPILE_SPECIALIZE_RELATIVE_STAT(NAME, DESC, FUNC)																										\
	log << TestLog::Float(statNamePrefix + "CompilationTime" + (NAME), (DESC) + string(" of compilation time"), "", QP_KEY_TAG_NONE, (FUNC)(rangeTotalTimes))		\
		<< TestLog::Float(statNamePrefix + "SpecializationTime" + (NAME), (DESC) + string(" of specialization time"), "", QP_KEY_TAG_NONE, (FUNC)(rangeSpecializationTimes))

			log << TestLog::Message << "\nStatistics computed from "
									<< (isEntireRange ? "all" : "only the lowest 50%")
									<< " of the above measurements:"
									<< TestLog::EndMessage;

			LOG_COMPILE_SPECIALIZE_TIME_STAT		("Median",							"Median",								vectorFloatMedian);
			LOG_COMPILE_SPECIALIZE_TIME_STAT		("Average",							"Average",								vectorFloatAverage);
			LOG_COMPILE_SPECIALIZE_TIME_STAT		("Minimum",							"Minimum",								vectorFloatMinimum);
			LOG_COMPILE_SPECIALIZE_TIME_STAT		("Maximum",							"Maximum",								vectorFloatMaximum);
			LOG_COMPILE_SPECIALIZE_TIME_STAT		("MedianAbsoluteDeviation",			"Median absolute deviation",			vectorFloatMedianAbsoluteDeviation);
			LOG_COMPILE_SPECIALIZE_RELATIVE_STAT	("RelativeMedianAbsoluteDeviation",	"Relative median absolute deviation",	vectorFloatRelativeMedianAbsoluteDeviation);
			LOG_COMPILE_SPECIALIZE_TIME_STAT		("StandardDeviation",				"Standard deviation",					vectorFloatStandardDeviation);
			LOG_COMPILE_SPECIALIZE_RELATIVE_STAT	("RelativeStandardDeviation",		"Relative standard deviation",			vectorFloatRelativeStandardDeviation);
			LOG_COMPILE_SPECIALIZE_TIME_STAT		("MaxMinusMin",						"Max-min",								vectorFloatMaximumMinusMinimum);
			LOG_COMPILE_SPECIALIZE_RELATIVE_STAT	("RelativeMaxMinusMin",				"Relative max-min",						vectorFloatRelativeMaximumMinusMinimum);

#undef LOG_COMPILE_SPECIALIZE_RELATIVE_STAT
#undef LOG_COMPILE_SPECIALIZE_TIME_STAT

			if (!isEntireRange && vectorFloatRelativeMedianAbsoluteDeviation(rangeTotalTimes) > RELATIVE_MEDIAN_ABSOLUTE_DEVIATION_THRESHOLD)
				log << TestLog::Message << "\nWARNING: couldn't achieve relative median absolute deviation under threshold value "
										<< RELATIVE_MEDIAN_ABSOLUTE_DEVIATION_THRESHOLD
										<< " for compilation time of the lowest 50% of measurements" << TestLog::EndMessage;
		}

		log << TestLog::EndSection; // End section IterationMeasurements

		for (int medianOrAverage = 0; medianOrAverage < 2; medianOrAverage++)
		{
			typedef float (*VecFunc)(const vector<deInt64>&);

			bool	isMedian						= medianOrAverage == 0;
			string	singular						= isMedian ? "Median" : "Average";
			string	plural							= singular + "s";
			VecFunc	func							= isMedian ? (VecFunc) vectorFloatMedian<deInt64> : (VecFunc) vectorFloatAverage<deInt64>;

			log << TestLog::Section(plural + "PerPhase", plural + " per phase");

			for (int entireRangeOrLowestHalf = 0; entireRangeOrLowestHalf < 2; entireRangeOrLowestHalf++)
			{
				bool	isEntireRange	= entireRangeOrLowestHalf == 0;
				string	statNamePrefix	= isEntireRange ? "" : "LowestHalf";
				float	rangeSizeRatio	= isEntireRange ? 1.0f : 0.5f;

#define LOG_TIME(NAME, DESC, DATA) log << TestLog::Float(statNamePrefix + (NAME) + singular, singular + " of " + (DESC), "ms", QP_KEY_TAG_TIME, func(vectorLowestPercentage((DATA), rangeSizeRatio))/1000.0f);

				log << TestLog::Message << (isEntireRange ? "For all measurements:" : "\nFor only the lowest 50% of the measurements:") << TestLog::EndMessage;
				LOG_TIME("ShaderSourceSetTime",			"shader source set time",			sourceSetTimes);
				LOG_TIME("VertexShaderCompileTime",		"vertex shader compile time",		vertexCompileTimes);
				LOG_TIME("FragmentShaderCompileTime",	"fragment shader compile time",		fragmentCompileTimes);
				LOG_TIME("ProgramLinkTime",				"program link time",				programLinkTimes);
				LOG_TIME("FirstShaderInputSetTime",		"first shader input set time",		firstInputSetTimes);
				LOG_TIME("FirstDrawTime",				"first draw time",					firstDrawTimes);
				LOG_TIME("SecondShaderInputSetTime",	"second shader input set time",		secondInputTimes);
				LOG_TIME("SecondDrawTime",				"second draw time",					secondDrawTimes);

#undef LOG_TIME
			}

			log << TestLog::EndSection;
		}

		// Set result.

		{
			log << TestLog::Message << "Note: test result is the first quartile (i.e. median of the lowest half of measurements) of compilation times" << TestLog::EndMessage;
			float result = vectorFloatFirstQuartile(totalTimesWithoutDraw) / 1000.0f;
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString(result, 2).c_str());
		}

		// Log shaders.

		if (m_avoidCache || m_addWhitespaceAndComments)
		{
			string msg = "Note: the following shaders are the ones from the last iteration; ";

			if (m_avoidCache)
				msg += "variables' names and some constant expressions";
			if (m_addWhitespaceAndComments)
				msg += string(m_avoidCache ? " as well as " : "") + "whitespace and comments";

			msg += " differ between iterations.";

			log << TestLog::Message << msg.c_str() << TestLog::EndMessage;
		}

		logProgramData(latestBuildInfo, latestProgramContext);

		return STOP;
	}
}